

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::QuadMvIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersectCoherent(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,
                        RayQueryContext *context)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  float *pfVar4;
  undefined4 uVar5;
  Geometry *pGVar6;
  RTCRayQueryContext *pRVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  float fVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined8 uVar75;
  uint uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong *puVar82;
  size_t i;
  long lVar83;
  long lVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar118;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  float fVar113;
  float fVar117;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar111;
  float fVar112;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 in_ZMM0 [64];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar130;
  float fVar135;
  float fVar136;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar137;
  undefined1 auVar138 [16];
  float fVar146;
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar148;
  undefined1 auVar143 [32];
  undefined1 auVar145 [64];
  float fVar152;
  undefined1 auVar153 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar154 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar163;
  float fVar164;
  undefined1 auVar155 [32];
  undefined1 auVar162 [64];
  undefined1 auVar169 [32];
  undefined1 auVar165 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar179 [16];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar186;
  float fVar187;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar195;
  float fVar197;
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar185;
  float fVar188;
  float fVar194;
  float fVar196;
  float fVar198;
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar206;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar208 [16];
  float fVar207;
  float fVar211;
  float fVar212;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar209 [32];
  float fVar213;
  undefined1 auVar210 [32];
  undefined1 auVar218 [16];
  float fVar217;
  float fVar221;
  float fVar222;
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar219 [32];
  float fVar223;
  undefined1 auVar220 [32];
  float fVar227;
  float fVar229;
  uint uVar230;
  float fVar231;
  uint uVar232;
  float fVar233;
  uint uVar234;
  float fVar235;
  uint uVar236;
  float fVar237;
  uint uVar238;
  float fVar239;
  uint uVar240;
  undefined1 auVar228 [32];
  uint uVar241;
  undefined1 auVar242 [32];
  uint uVar243;
  undefined1 auVar244 [36];
  undefined1 auVar245 [36];
  undefined1 auVar248 [64];
  undefined1 auVar249 [36];
  float fVar250;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  undefined1 auVar251 [64];
  RTCFilterFunctionNArguments args;
  vfloat<8> fmin;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  RTCFilterFunctionNArguments local_2b00;
  long local_2ad0;
  long local_2ac8;
  undefined1 local_2ac0 [32];
  undefined1 local_2aa0 [16];
  undefined1 (*local_2a90) [32];
  RayHitK<8> *local_2a88;
  RayHitK<8> *local_2a80;
  RayHitK<8> *local_2a78;
  RayHitK<8> *local_2a70;
  RayHitK<8> *local_2a68;
  RayHitK<8> *local_2a60;
  RayHitK<8> *local_2a58;
  RayHitK<8> *local_2a50;
  RayHitK<8> *local_2a48;
  undefined1 local_2a40 [12];
  undefined4 uStack_2a34;
  undefined4 uStack_2a30;
  undefined4 uStack_2a2c;
  undefined4 uStack_2a28;
  undefined4 uStack_2a24;
  undefined1 local_2a20 [32];
  undefined1 local_29f0 [16];
  undefined1 local_29e0 [32];
  Geometry *local_29a8;
  ulong local_29a0;
  long local_2998;
  ulong local_2990;
  ulong local_2988;
  ulong local_2980;
  ulong local_2978;
  ulong local_2970;
  ulong local_2968;
  undefined1 local_2960 [32];
  RayHitK<8> *local_2940;
  undefined1 auStack_2938 [24];
  ulong local_2920;
  undefined1 auStack_2918 [24];
  undefined8 local_28f0;
  undefined8 uStack_28e8;
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [8];
  float fStack_28b8;
  float fStack_28b4;
  float fStack_28b0;
  float fStack_28ac;
  float fStack_28a8;
  float fStack_28a4;
  undefined1 local_28a0 [8];
  float fStack_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float fStack_2888;
  float fStack_2884;
  undefined1 local_2880 [8];
  float fStack_2878;
  float fStack_2874;
  float fStack_2870;
  float fStack_286c;
  float fStack_2868;
  float fStack_2864;
  undefined1 local_2860 [32];
  float local_2840;
  float fStack_283c;
  float fStack_2838;
  float fStack_2834;
  float fStack_2830;
  float fStack_282c;
  float fStack_2828;
  float fStack_2824;
  float local_2820;
  float fStack_281c;
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  float fStack_2804;
  float local_2800;
  float fStack_27fc;
  float fStack_27f8;
  float fStack_27f4;
  float fStack_27f0;
  float fStack_27ec;
  float fStack_27e8;
  float fStack_27e4;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  RTCHitN local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [16];
  undefined1 auStack_26d0 [16];
  undefined1 local_26c0 [16];
  undefined1 auStack_26b0 [16];
  uint local_26a0;
  uint uStack_269c;
  uint uStack_2698;
  uint uStack_2694;
  uint uStack_2690;
  uint uStack_268c;
  uint uStack_2688;
  uint uStack_2684;
  uint local_2680;
  uint uStack_267c;
  uint uStack_2678;
  uint uStack_2674;
  uint uStack_2670;
  uint uStack_266c;
  uint uStack_2668;
  uint uStack_2664;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  float local_25c0;
  float fStack_25bc;
  float fStack_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  undefined4 local_2580;
  undefined4 uStack_257c;
  undefined4 uStack_2578;
  undefined4 uStack_2574;
  undefined4 uStack_2570;
  undefined4 uStack_256c;
  undefined4 uStack_2568;
  undefined4 uStack_2564;
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [8];
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  undefined1 local_2500 [32];
  undefined1 local_24e0 [8];
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [8];
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  undefined1 local_2480 [32];
  undefined1 local_2460 [8];
  float fStack_2458;
  float fStack_2454;
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  undefined1 local_2440 [32];
  undefined1 local_2420 [8];
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  undefined1 local_2400 [32];
  undefined1 local_23e0 [8];
  float fStack_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  undefined1 local_23c0 [32];
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar129 [36];
  undefined1 auVar144 [64];
  undefined1 auVar175 [64];
  undefined1 auVar172 [32];
  undefined1 auVar184 [64];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  
  auVar166 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar85 = vpcmpeqd_avx(auVar166,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
  auVar166 = vpcmpeqd_avx(auVar166,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
  auVar166 = vpackssdw_avx(auVar85,auVar166);
  if ((((((((((((((((auVar166 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar166 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar166 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar166 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar166 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar166 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar166 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar166 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar166 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar166 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar166 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar166 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar166 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar166 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar166 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar166[0xf]) {
    return;
  }
  auVar85 = vpacksswb_avx(auVar166,auVar166);
  local_2aa0._0_8_ = This->ptr;
  local_2920 = (ulong)(byte)(SUB161(auVar85 >> 7,0) & 1 | (SUB161(auVar85 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar85 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar85 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar85 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar85 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar85 >> 0x37,0) & 1) << 6 | SUB161(auVar85 >> 0x3f,0) << 7);
  local_27a0 = *(undefined8 *)ray;
  uStack_2798 = *(undefined8 *)(ray + 8);
  uStack_2790 = *(undefined8 *)(ray + 0x10);
  uStack_2788 = *(undefined8 *)(ray + 0x18);
  local_27c0 = *(undefined8 *)(ray + 0x20);
  uStack_27b8 = *(undefined8 *)(ray + 0x28);
  uStack_27b0 = *(undefined8 *)(ray + 0x30);
  uStack_27a8 = *(undefined8 *)(ray + 0x38);
  local_27e0 = *(undefined8 *)(ray + 0x40);
  uStack_27d8 = *(undefined8 *)(ray + 0x48);
  uStack_27d0 = *(undefined8 *)(ray + 0x50);
  uStack_27c8 = *(undefined8 *)(ray + 0x58);
  auVar140 = *(undefined1 (*) [32])(ray + 0x80);
  auVar201._8_4_ = 0x7fffffff;
  auVar201._0_8_ = 0x7fffffff7fffffff;
  auVar201._12_4_ = 0x7fffffff;
  auVar201._16_4_ = 0x7fffffff;
  auVar201._20_4_ = 0x7fffffff;
  auVar201._24_4_ = 0x7fffffff;
  auVar201._28_4_ = 0x7fffffff;
  auVar9 = vandps_avx(auVar140,auVar201);
  auVar155._8_4_ = 0x219392ef;
  auVar155._0_8_ = 0x219392ef219392ef;
  auVar155._12_4_ = 0x219392ef;
  auVar155._16_4_ = 0x219392ef;
  auVar155._20_4_ = 0x219392ef;
  auVar155._24_4_ = 0x219392ef;
  auVar155._28_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar155,1);
  auVar167 = vblendvps_avx(auVar140,auVar155,auVar9);
  auVar9 = *(undefined1 (*) [32])(ray + 0xa0);
  auVar86 = vandps_avx(auVar9,auVar201);
  auVar86 = vcmpps_avx(auVar86,auVar155,1);
  auVar10 = vblendvps_avx(auVar9,auVar155,auVar86);
  auVar86 = *(undefined1 (*) [32])(ray + 0xc0);
  auVar139 = vandps_avx(auVar86,auVar201);
  auVar139 = vcmpps_avx(auVar139,auVar155,1);
  auVar139 = vblendvps_avx(auVar86,auVar155,auVar139);
  auVar25 = vrcpps_avx(auVar167);
  fVar118 = auVar25._0_4_;
  fVar112 = auVar25._4_4_;
  auVar26._4_4_ = fVar112 * auVar167._4_4_;
  auVar26._0_4_ = fVar118 * auVar167._0_4_;
  fVar113 = auVar25._8_4_;
  auVar26._8_4_ = fVar113 * auVar167._8_4_;
  fVar114 = auVar25._12_4_;
  auVar26._12_4_ = fVar114 * auVar167._12_4_;
  fVar115 = auVar25._16_4_;
  auVar26._16_4_ = fVar115 * auVar167._16_4_;
  fVar117 = auVar25._20_4_;
  auVar26._20_4_ = fVar117 * auVar167._20_4_;
  fVar116 = auVar25._24_4_;
  auVar26._24_4_ = fVar116 * auVar167._24_4_;
  auVar26._28_4_ = auVar167._28_4_;
  auVar228._8_4_ = 0x3f800000;
  auVar228._0_8_ = 0x3f8000003f800000;
  auVar228._12_4_ = 0x3f800000;
  auVar228._16_4_ = 0x3f800000;
  auVar228._20_4_ = 0x3f800000;
  auVar228._24_4_ = 0x3f800000;
  auVar228._28_4_ = 0x3f800000;
  auVar26 = vsubps_avx(auVar228,auVar26);
  auVar167 = vrcpps_avx(auVar10);
  fStack_27e4 = auVar25._28_4_ + auVar26._28_4_;
  local_2800 = fVar118 + fVar118 * auVar26._0_4_;
  fStack_27fc = fVar112 + fVar112 * auVar26._4_4_;
  fStack_27f8 = fVar113 + fVar113 * auVar26._8_4_;
  fStack_27f4 = fVar114 + fVar114 * auVar26._12_4_;
  fStack_27f0 = fVar115 + fVar115 * auVar26._16_4_;
  fStack_27ec = fVar117 + fVar117 * auVar26._20_4_;
  fStack_27e8 = fVar116 + fVar116 * auVar26._24_4_;
  fVar118 = auVar167._0_4_;
  fVar112 = auVar167._4_4_;
  auVar25._4_4_ = fVar112 * auVar10._4_4_;
  auVar25._0_4_ = fVar118 * auVar10._0_4_;
  fVar113 = auVar167._8_4_;
  auVar25._8_4_ = fVar113 * auVar10._8_4_;
  fVar114 = auVar167._12_4_;
  auVar25._12_4_ = fVar114 * auVar10._12_4_;
  fVar115 = auVar167._16_4_;
  auVar25._16_4_ = fVar115 * auVar10._16_4_;
  fVar117 = auVar167._20_4_;
  auVar25._20_4_ = fVar117 * auVar10._20_4_;
  fVar116 = auVar167._24_4_;
  auVar25._24_4_ = fVar116 * auVar10._24_4_;
  auVar25._28_4_ = fStack_27e4;
  auVar10 = vsubps_avx(auVar228,auVar25);
  local_2820 = fVar118 + fVar118 * auVar10._0_4_;
  fStack_281c = fVar112 + fVar112 * auVar10._4_4_;
  fStack_2818 = fVar113 + fVar113 * auVar10._8_4_;
  fStack_2814 = fVar114 + fVar114 * auVar10._12_4_;
  fStack_2810 = fVar115 + fVar115 * auVar10._16_4_;
  fStack_280c = fVar117 + fVar117 * auVar10._20_4_;
  fStack_2808 = fVar116 + fVar116 * auVar10._24_4_;
  fStack_2804 = auVar167._28_4_ + auVar10._28_4_;
  auVar167 = vrcpps_avx(auVar139);
  fVar118 = auVar167._0_4_;
  fVar112 = auVar167._4_4_;
  auVar10._4_4_ = auVar139._4_4_ * fVar112;
  auVar10._0_4_ = auVar139._0_4_ * fVar118;
  fVar113 = auVar167._8_4_;
  auVar10._8_4_ = auVar139._8_4_ * fVar113;
  fVar114 = auVar167._12_4_;
  auVar10._12_4_ = auVar139._12_4_ * fVar114;
  fVar115 = auVar167._16_4_;
  auVar10._16_4_ = auVar139._16_4_ * fVar115;
  fVar117 = auVar167._20_4_;
  auVar10._20_4_ = auVar139._20_4_ * fVar117;
  fVar116 = auVar167._24_4_;
  auVar10._24_4_ = auVar139._24_4_ * fVar116;
  auVar10._28_4_ = auVar139._28_4_;
  auVar139 = vsubps_avx(auVar228,auVar10);
  local_2840 = fVar118 + fVar118 * auVar139._0_4_;
  fStack_283c = fVar112 + fVar112 * auVar139._4_4_;
  fStack_2838 = fVar113 + fVar113 * auVar139._8_4_;
  fStack_2834 = fVar114 + fVar114 * auVar139._12_4_;
  fStack_2830 = fVar115 + fVar115 * auVar139._16_4_;
  fStack_282c = fVar117 + fVar117 * auVar139._20_4_;
  fStack_2828 = fVar116 + fVar116 * auVar139._24_4_;
  fStack_2824 = auVar167._28_4_ + auVar139._28_4_;
  local_2600 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT832(0) << 0x20);
  local_2940 = ray + 0x100;
  auVar140 = vcmpps_avx(auVar140,ZEXT832(0) << 0x20,1);
  auVar167._8_4_ = 1;
  auVar167._0_8_ = 0x100000001;
  auVar167._12_4_ = 1;
  auVar167._16_4_ = 1;
  auVar167._20_4_ = 1;
  auVar167._24_4_ = 1;
  auVar167._28_4_ = 1;
  auVar140 = vandps_avx(auVar140,auVar167);
  auVar167 = ZEXT832(0) << 0x20;
  auVar9 = vcmpps_avx(auVar9,auVar167,1);
  auVar168._8_4_ = 2;
  auVar168._0_8_ = 0x200000002;
  auVar168._12_4_ = 2;
  auVar168._16_4_ = 2;
  auVar168._20_4_ = 2;
  auVar168._24_4_ = 2;
  auVar168._28_4_ = 2;
  auVar9 = vandps_avx(auVar9,auVar168);
  auVar9 = vorps_avx(auVar9,auVar140);
  auVar140 = vcmpps_avx(auVar86,auVar167,1);
  auVar139._8_4_ = 4;
  auVar139._0_8_ = 0x400000004;
  auVar139._12_4_ = 4;
  auVar139._16_4_ = 4;
  auVar139._20_4_ = 4;
  auVar139._24_4_ = 4;
  auVar139._28_4_ = 4;
  auVar140 = vandps_avx(auVar140,auVar139);
  auVar9 = vorps_avx(auVar9,auVar140);
  auVar85 = vpmovsxwd_avx(auVar166);
  auVar166 = vpunpckhwd_avx(auVar166,auVar166);
  auVar86._16_16_ = auVar166;
  auVar86._0_16_ = auVar85;
  auVar140 = vcmpps_avx(ZEXT1632(auVar85),ZEXT1632(auVar85),0xf);
  local_2860 = vblendvps_avx(auVar140,auVar9,auVar86);
  local_2620 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar167);
  local_2640 = mm_lookupmask_ps._16_8_;
  uStack_2638 = mm_lookupmask_ps._24_8_;
  uStack_2630 = mm_lookupmask_ps._16_8_;
  uStack_2628 = mm_lookupmask_ps._24_8_;
  local_2a90 = (undefined1 (*) [32])&local_26a0;
  local_2a48 = ray + 0x180;
  local_2a50 = ray + 0x1a0;
  local_2a58 = ray + 0x1c0;
  local_2a60 = ray + 0x1e0;
  local_2a68 = ray + 0x200;
  local_2a70 = ray + 0x220;
  local_2660 = mm_lookupmask_pd._0_8_;
  uStack_2658 = mm_lookupmask_pd._8_8_;
  uStack_2650 = mm_lookupmask_pd._0_8_;
  uStack_2648 = mm_lookupmask_pd._8_8_;
  local_2a78 = ray + 0x240;
  local_2a80 = ray + 0x260;
  local_2a88 = ray + 0x280;
LAB_00460c10:
  puVar82 = local_2390;
  lVar84 = 0;
  if (local_2920 != 0) {
    for (; (local_2920 >> lVar84 & 1) == 0; lVar84 = lVar84 + 1) {
    }
  }
  uVar5 = *(undefined4 *)(local_2860 + lVar84 * 4);
  auVar85._4_4_ = uVar5;
  auVar85._0_4_ = uVar5;
  auVar85._8_4_ = uVar5;
  auVar85._12_4_ = uVar5;
  auVar166 = vpcmpeqd_avx(auVar85,local_2860._0_16_);
  auVar85 = vpcmpeqd_avx(auVar85,local_2860._16_16_);
  auVar166 = vpackssdw_avx(auVar166,auVar85);
  auVar154 = vpmovsxwd_avx(auVar166);
  auVar165 = vpunpckhwd_avx(auVar166,auVar166);
  auVar131._16_16_ = auVar165;
  auVar131._0_16_ = auVar154;
  auVar166 = vpacksswb_avx(auVar166,auVar166);
  auVar246._8_4_ = 0xff800000;
  auVar246._0_8_ = 0xff800000ff800000;
  auVar246._12_4_ = 0xff800000;
  auVar247._16_4_ = 0xff800000;
  auVar247._0_16_ = auVar246;
  auVar247._20_4_ = 0xff800000;
  auVar247._24_4_ = 0xff800000;
  auVar247._28_4_ = 0xff800000;
  auVar248 = ZEXT3264(auVar247);
  auVar140 = vblendvps_avx(auVar247,local_2620,auVar131);
  auVar251 = ZEXT3264(auVar140);
  local_29a0 = ~(ulong)(byte)(SUB161(auVar166 >> 7,0) & 1 | (SUB161(auVar166 >> 0xf,0) & 1) << 1 |
                              (SUB161(auVar166 >> 0x17,0) & 1) << 2 |
                              (SUB161(auVar166 >> 0x1f,0) & 1) << 3 |
                              (SUB161(auVar166 >> 0x27,0) & 1) << 4 |
                              (SUB161(auVar166 >> 0x2f,0) & 1) << 5 |
                              (SUB161(auVar166 >> 0x37,0) & 1) << 6 |
                             SUB161(auVar166 >> 0x3f,0) << 7);
  auVar67._8_8_ = uStack_2798;
  auVar67._0_8_ = local_27a0;
  auVar67._16_8_ = uStack_2790;
  auVar67._24_8_ = uStack_2788;
  auVar242._8_4_ = 0x7f800000;
  auVar242._0_8_ = 0x7f8000007f800000;
  auVar242._12_4_ = 0x7f800000;
  auVar242._16_4_ = 0x7f800000;
  auVar242._20_4_ = 0x7f800000;
  auVar242._24_4_ = 0x7f800000;
  auVar242._28_4_ = 0x7f800000;
  auVar9 = vblendvps_avx(auVar242,auVar67,auVar131);
  auVar86 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vminps_avx(auVar9,auVar86);
  auVar86 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vminps_avx(auVar9,auVar86);
  auVar166 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar65._8_8_ = uStack_27b8;
  auVar65._0_8_ = local_27c0;
  auVar65._16_8_ = uStack_27b0;
  auVar65._24_8_ = uStack_27a8;
  auVar9 = vblendvps_avx(auVar242,auVar65,auVar131);
  auVar86 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vminps_avx(auVar9,auVar86);
  auVar86 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vminps_avx(auVar9,auVar86);
  auVar85 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar85 = vunpcklps_avx(auVar166,auVar85);
  auVar63._8_8_ = uStack_27d8;
  auVar63._0_8_ = local_27e0;
  auVar63._16_8_ = uStack_27d0;
  auVar63._24_8_ = uStack_27c8;
  auVar9 = vblendvps_avx(auVar242,auVar63,auVar131);
  auVar86 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vminps_avx(auVar9,auVar86);
  auVar86 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vminps_avx(auVar9,auVar86);
  auVar166 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar9 = vblendvps_avx(auVar247,auVar67,auVar131);
  auVar138 = vinsertps_avx(auVar85,auVar166,0x28);
  auVar86 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vmaxps_avx(auVar9,auVar86);
  auVar86 = vshufpd_avx(auVar9,auVar9,5);
  auVar86 = vmaxps_avx(auVar9,auVar86);
  auVar9 = vblendvps_avx(auVar247,auVar65,auVar131);
  auVar166 = vmaxps_avx(auVar86._0_16_,auVar86._16_16_);
  auVar86 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vmaxps_avx(auVar9,auVar86);
  auVar86 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vmaxps_avx(auVar9,auVar86);
  auVar85 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar85 = vunpcklps_avx(auVar166,auVar85);
  auVar9 = vblendvps_avx(auVar247,auVar63,auVar131);
  auVar86 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vmaxps_avx(auVar9,auVar86);
  auVar86 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vmaxps_avx(auVar9,auVar86);
  auVar166 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar12 = vinsertps_avx(auVar85,auVar166,0x28);
  auVar62._4_4_ = fStack_27fc;
  auVar62._0_4_ = local_2800;
  auVar62._8_4_ = fStack_27f8;
  auVar62._12_4_ = fStack_27f4;
  auVar62._16_4_ = fStack_27f0;
  auVar62._20_4_ = fStack_27ec;
  auVar62._24_4_ = fStack_27e8;
  auVar62._28_4_ = fStack_27e4;
  auVar9 = vblendvps_avx(auVar242,auVar62,auVar131);
  auVar86 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vminps_avx(auVar9,auVar86);
  auVar86 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vminps_avx(auVar9,auVar86);
  auVar166 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar61._4_4_ = fStack_281c;
  auVar61._0_4_ = local_2820;
  auVar61._8_4_ = fStack_2818;
  auVar61._12_4_ = fStack_2814;
  auVar61._16_4_ = fStack_2810;
  auVar61._20_4_ = fStack_280c;
  auVar61._24_4_ = fStack_2808;
  auVar61._28_4_ = fStack_2804;
  auVar9 = vblendvps_avx(auVar242,auVar61,auVar131);
  auVar86 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vminps_avx(auVar9,auVar86);
  auVar86 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vminps_avx(auVar9,auVar86);
  auVar85 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar85 = vunpcklps_avx(auVar166,auVar85);
  auVar60._4_4_ = fStack_283c;
  auVar60._0_4_ = local_2840;
  auVar60._8_4_ = fStack_2838;
  auVar60._12_4_ = fStack_2834;
  auVar60._16_4_ = fStack_2830;
  auVar60._20_4_ = fStack_282c;
  auVar60._24_4_ = fStack_2828;
  auVar60._28_4_ = fStack_2824;
  auVar9 = vblendvps_avx(auVar242,auVar60,auVar131);
  auVar86 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vminps_avx(auVar9,auVar86);
  auVar86 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vminps_avx(auVar9,auVar86);
  auVar166 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar9 = vblendvps_avx(auVar247,auVar62,auVar131);
  auVar153 = vinsertps_avx(auVar85,auVar166,0x28);
  auVar86 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vmaxps_avx(auVar9,auVar86);
  auVar86 = vshufpd_avx(auVar9,auVar9,5);
  auVar86 = vmaxps_avx(auVar9,auVar86);
  auVar9 = vblendvps_avx(auVar247,auVar61,auVar131);
  auVar166 = vmaxps_avx(auVar86._0_16_,auVar86._16_16_);
  auVar86 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vmaxps_avx(auVar9,auVar86);
  auVar86 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vmaxps_avx(auVar9,auVar86);
  auVar85 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar85 = vunpcklps_avx(auVar166,auVar85);
  auVar9 = vblendvps_avx(auVar247,auVar60,auVar131);
  auVar86 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar9 = vmaxps_avx(auVar9,auVar86);
  auVar86 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vmaxps_avx(auVar9,auVar86);
  auVar166 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar199 = vinsertps_avx(auVar85,auVar166,0x28);
  local_23c0 = vblendvps_avx(auVar242,local_2600,auVar131);
  auVar9 = vshufps_avx(local_23c0,local_23c0,0xb1);
  auVar9 = vminps_avx(local_23c0,auVar9);
  auVar86 = vshufpd_avx(auVar9,auVar9,5);
  auVar9 = vminps_avx(auVar9,auVar86);
  auVar86 = vshufps_avx(auVar140,auVar140,0xb1);
  auVar140 = vmaxps_avx(auVar140,auVar86);
  auVar86 = vshufpd_avx(auVar140,auVar140,5);
  auVar140 = vmaxps_avx(auVar140,auVar86);
  auVar11 = vcmpps_avx(auVar153,_DAT_01f7aa10,5);
  auVar166 = vblendvps_avx(auVar199,auVar153,auVar11);
  auVar182 = ZEXT1664(auVar166);
  auVar85 = vblendvps_avx(auVar138,auVar12,auVar11);
  auVar138 = vblendvps_avx(auVar12,auVar138,auVar11);
  local_29f0 = vmaxps_avx(auVar140._0_16_,auVar140._16_16_);
  auVar12 = vmovshdup_avx(auVar166);
  local_2970 = (ulong)(auVar12._0_4_ < 0.0) << 5 | 0x40;
  auVar12 = vshufpd_avx(auVar166,auVar166,1);
  local_2978 = (ulong)(auVar12._0_4_ < 0.0) << 5 | 0x80;
  local_2980 = local_2970 ^ 0x20;
  auVar12 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
  auVar11 = vblendvps_avx(auVar153,auVar199,auVar11);
  auVar199._0_4_ = auVar85._0_4_ * auVar166._0_4_;
  auVar199._4_4_ = auVar85._4_4_ * auVar166._4_4_;
  auVar199._8_4_ = auVar85._8_4_ * auVar166._8_4_;
  auVar199._12_4_ = auVar85._12_4_ * auVar166._12_4_;
  auVar153._0_4_ = auVar138._0_4_ * auVar11._0_4_;
  auVar153._4_4_ = auVar138._4_4_ * auVar11._4_4_;
  auVar153._8_4_ = auVar138._8_4_ * auVar11._8_4_;
  auVar153._12_4_ = auVar138._12_4_ * auVar11._12_4_;
  local_2968 = (ulong)(auVar166._0_4_ < 0.0) << 5;
  local_2988 = local_2968 ^ 0x20;
  local_2990 = local_2978 ^ 0x20;
  local_23a0 = *(ulong *)&(((AccelData *)(local_2aa0._0_8_ + 0x60))->bounds).bounds0.lower.field_0;
  local_2398[0] = 0;
  auVar85 = vshufps_avx(auVar166,auVar166,0);
  register0x00001350 = auVar85;
  _local_23e0 = auVar85;
  auVar85 = vshufps_avx(auVar199,auVar199,0);
  local_2400._16_16_ = auVar85;
  local_2400._0_16_ = auVar85;
  auVar85 = vshufps_avx(auVar166,auVar166,0x55);
  register0x00001350 = auVar85;
  _local_2420 = auVar85;
  auVar85 = vshufps_avx(auVar199,auVar199,0x55);
  local_2440._16_16_ = auVar85;
  local_2440._0_16_ = auVar85;
  auVar166 = vshufps_avx(auVar166,auVar166,0xaa);
  register0x00001350 = auVar166;
  _local_2460 = auVar166;
  auVar166 = vshufps_avx(auVar199,auVar199,0xaa);
  local_2480._16_16_ = auVar166;
  local_2480._0_16_ = auVar166;
  auVar166 = vshufps_avx(auVar11,auVar11,0);
  register0x00001350 = auVar166;
  _local_24a0 = auVar166;
  auVar166 = vblendvps_avx(auVar246,local_2620._16_16_,auVar165);
  local_29e0._0_16_ = auVar166;
  auVar166 = vshufps_avx(auVar153,auVar153,0);
  local_24c0._16_16_ = auVar166;
  local_24c0._0_16_ = auVar166;
  auVar166 = vshufps_avx(auVar11,auVar11,0x55);
  register0x00001210 = auVar166;
  _local_24e0 = auVar166;
  auVar166 = vshufps_avx(auVar153,auVar153,0x55);
  auVar173 = ZEXT1664(auVar166);
  local_2500._16_16_ = auVar166;
  local_2500._0_16_ = auVar166;
  auVar166 = vshufps_avx(auVar11,auVar11,0xaa);
  register0x00001210 = auVar166;
  _local_2520 = auVar166;
  auVar166 = vshufps_avx(auVar153,auVar153,0xaa);
  local_2540._16_16_ = auVar166;
  local_2540._0_16_ = auVar166;
  auVar166 = vshufps_avx(auVar12,auVar12,0);
  local_2560._16_16_ = auVar166;
  local_2560._0_16_ = auVar166;
  auVar166 = vblendvps_avx(auVar246,local_2620._0_16_,auVar154);
  local_2a20._0_16_ = auVar166;
  auVar166 = vshufps_avx(local_29f0,local_29f0,0);
  _local_2a40 = auVar166;
LAB_004610c0:
  local_2960 = auVar251._0_32_;
  while( true ) {
    uVar5 = (undefined4)puVar82[-1];
    auVar140._4_4_ = uVar5;
    auVar140._0_4_ = uVar5;
    auVar140._8_4_ = uVar5;
    auVar140._12_4_ = uVar5;
    auVar140._16_4_ = uVar5;
    auVar140._20_4_ = uVar5;
    auVar140._24_4_ = uVar5;
    auVar140._28_4_ = uVar5;
    auVar144 = ZEXT3264(auVar140);
    puVar82 = puVar82 + -2;
    auVar140 = vcmpps_avx(auVar140,auVar251._0_32_,1);
    auVar251 = ZEXT3264(auVar140);
    if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar140 >> 0x7f,0) == '\0') &&
          (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar140 >> 0xbf,0) == '\0') &&
        (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar140[0x1f])
    break;
    uVar79 = *puVar82;
    while( true ) {
      if ((uVar79 & 8) != 0) {
        auVar251 = ZEXT3264(local_2960);
        auVar140 = vcmpps_avx(local_2960,auVar144._0_32_,6);
        if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar140 >> 0x7f,0) == '\0') &&
              (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar140 >> 0xbf,0) == '\0') &&
            (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar140[0x1f]) goto LAB_004624cc;
        local_2ac8 = (ulong)((uint)uVar79 & 0xf) - 8;
        local_29e0 = auVar140;
        if (local_2ac8 == 0) goto LAB_00462479;
        lVar84 = (uVar79 & 0xfffffffffffffff0) + 0xc0;
        local_2ad0 = 0;
        goto LAB_0046156a;
      }
      pfVar4 = (float *)(uVar79 + 0x40 + local_2968);
      auVar145._0_4_ = (float)local_23e0._0_4_ * *pfVar4;
      auVar145._4_4_ = (float)local_23e0._4_4_ * pfVar4[1];
      auVar145._8_4_ = fStack_23d8 * pfVar4[2];
      auVar145._12_4_ = fStack_23d4 * pfVar4[3];
      auVar145._16_4_ = fStack_23d0 * pfVar4[4];
      auVar145._20_4_ = fStack_23cc * pfVar4[5];
      auVar145._28_36_ = auVar144._28_36_;
      auVar145._24_4_ = fStack_23c8 * pfVar4[6];
      auVar140 = vsubps_avx(auVar145._0_32_,local_2400);
      pfVar4 = (float *)(uVar79 + 0x40 + local_2970);
      auVar162._0_4_ = (float)local_2420._0_4_ * *pfVar4;
      auVar162._4_4_ = (float)local_2420._4_4_ * pfVar4[1];
      auVar162._8_4_ = fStack_2418 * pfVar4[2];
      auVar162._12_4_ = fStack_2414 * pfVar4[3];
      auVar162._16_4_ = fStack_2410 * pfVar4[4];
      auVar162._20_4_ = fStack_240c * pfVar4[5];
      auVar162._28_36_ = auVar251._28_36_;
      auVar162._24_4_ = fStack_2408 * pfVar4[6];
      pfVar4 = (float *)(uVar79 + 0x40 + local_2978);
      auVar174._0_4_ = (float)local_2460._0_4_ * *pfVar4;
      auVar174._4_4_ = (float)local_2460._4_4_ * pfVar4[1];
      auVar174._8_4_ = fStack_2458 * pfVar4[2];
      auVar174._12_4_ = fStack_2454 * pfVar4[3];
      auVar174._16_4_ = fStack_2450 * pfVar4[4];
      auVar174._20_4_ = fStack_244c * pfVar4[5];
      auVar174._28_36_ = auVar173._28_36_;
      auVar174._24_4_ = fStack_2448 * pfVar4[6];
      auVar9 = vsubps_avx(auVar162._0_32_,local_2440);
      auVar86 = vsubps_avx(auVar174._0_32_,local_2480);
      pfVar4 = (float *)(uVar79 + 0x40 + local_2988);
      auVar183._0_4_ = (float)local_24a0._0_4_ * *pfVar4;
      auVar183._4_4_ = (float)local_24a0._4_4_ * pfVar4[1];
      auVar183._8_4_ = fStack_2498 * pfVar4[2];
      auVar183._12_4_ = fStack_2494 * pfVar4[3];
      auVar183._16_4_ = fStack_2490 * pfVar4[4];
      auVar183._20_4_ = fStack_248c * pfVar4[5];
      auVar183._28_36_ = auVar182._28_36_;
      auVar183._24_4_ = fStack_2488 * pfVar4[6];
      auVar139 = vsubps_avx(auVar183._0_32_,local_24c0);
      auVar166 = vpmaxsd_avx(auVar140._0_16_,auVar9._0_16_);
      auVar85 = vpmaxsd_avx(auVar140._16_16_,auVar9._16_16_);
      auVar138 = vpmaxsd_avx(auVar86._0_16_,local_2560._0_16_);
      auVar166 = vpmaxsd_avx(auVar166,auVar138);
      auVar138 = vpmaxsd_avx(auVar86._16_16_,local_2560._16_16_);
      pfVar4 = (float *)(uVar79 + 0x40 + local_2980);
      auVar202._0_4_ = (float)local_24e0._0_4_ * *pfVar4;
      auVar202._4_4_ = (float)local_24e0._4_4_ * pfVar4[1];
      auVar202._8_4_ = fStack_24d8 * pfVar4[2];
      auVar202._12_4_ = fStack_24d4 * pfVar4[3];
      auVar202._16_4_ = fStack_24d0 * pfVar4[4];
      auVar202._20_4_ = fStack_24cc * pfVar4[5];
      auVar202._24_4_ = fStack_24c8 * pfVar4[6];
      auVar202._28_4_ = 0;
      auVar140 = vsubps_avx(auVar202,local_2500);
      auVar85 = vpmaxsd_avx(auVar85,auVar138);
      auVar141._16_16_ = auVar85;
      auVar141._0_16_ = auVar166;
      auVar138 = vpminsd_avx(auVar139._16_16_,auVar140._16_16_);
      pfVar4 = (float *)(uVar79 + 0x40 + local_2990);
      auVar169._0_4_ = (float)local_2520._0_4_ * *pfVar4;
      auVar169._4_4_ = (float)local_2520._4_4_ * pfVar4[1];
      auVar169._8_4_ = fStack_2518 * pfVar4[2];
      auVar169._12_4_ = fStack_2514 * pfVar4[3];
      auVar169._16_4_ = fStack_2510 * pfVar4[4];
      auVar169._20_4_ = fStack_250c * pfVar4[5];
      auVar169._24_4_ = fStack_2508 * pfVar4[6];
      auVar169._28_4_ = 0;
      auVar9 = vsubps_avx(auVar169,local_2540);
      auVar11 = vpminsd_avx(auVar139._0_16_,auVar140._0_16_);
      auVar12 = vpminsd_avx(auVar9._0_16_,_local_2a40);
      auVar11 = vpminsd_avx(auVar11,auVar12);
      auVar182 = ZEXT1664(auVar11);
      auVar12 = vpminsd_avx(auVar9._16_16_,_local_2a40);
      auVar173 = ZEXT1664(auVar12);
      auVar138 = vpminsd_avx(auVar138,auVar12);
      auVar156._16_16_ = auVar138;
      auVar156._0_16_ = auVar11;
      local_2780[0] = (RTCHitN)auVar166[0];
      local_2780[1] = (RTCHitN)auVar166[1];
      local_2780[2] = (RTCHitN)auVar166[2];
      local_2780[3] = (RTCHitN)auVar166[3];
      local_2780[4] = (RTCHitN)auVar166[4];
      local_2780[5] = (RTCHitN)auVar166[5];
      local_2780[6] = (RTCHitN)auVar166[6];
      local_2780[7] = (RTCHitN)auVar166[7];
      local_2780[8] = (RTCHitN)auVar166[8];
      local_2780[9] = (RTCHitN)auVar166[9];
      local_2780[10] = (RTCHitN)auVar166[10];
      local_2780[0xb] = (RTCHitN)auVar166[0xb];
      local_2780[0xc] = (RTCHitN)auVar166[0xc];
      local_2780[0xd] = (RTCHitN)auVar166[0xd];
      local_2780[0xe] = (RTCHitN)auVar166[0xe];
      local_2780[0xf] = (RTCHitN)auVar166[0xf];
      local_2780[0x10] = (RTCHitN)auVar85[0];
      local_2780[0x11] = (RTCHitN)auVar85[1];
      local_2780[0x12] = (RTCHitN)auVar85[2];
      local_2780[0x13] = (RTCHitN)auVar85[3];
      local_2780[0x14] = (RTCHitN)auVar85[4];
      local_2780[0x15] = (RTCHitN)auVar85[5];
      local_2780[0x16] = (RTCHitN)auVar85[6];
      local_2780[0x17] = (RTCHitN)auVar85[7];
      local_2780[0x18] = (RTCHitN)auVar85[8];
      local_2780[0x19] = (RTCHitN)auVar85[9];
      local_2780[0x1a] = (RTCHitN)auVar85[10];
      local_2780[0x1b] = (RTCHitN)auVar85[0xb];
      local_2780[0x1c] = (RTCHitN)auVar85[0xc];
      local_2780[0x1d] = (RTCHitN)auVar85[0xd];
      local_2780[0x1e] = (RTCHitN)auVar85[0xe];
      local_2780[0x1f] = (RTCHitN)auVar85[0xf];
      auVar140 = vcmpps_avx(auVar141,auVar156,2);
      uVar76 = vmovmskps_avx(auVar140);
      if (uVar76 == 0) break;
      uVar78 = (ulong)(uVar76 & 0xff);
      auVar144 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      uVar77 = 0;
      uVar80 = 8;
      do {
        lVar84 = 0;
        if (uVar78 != 0) {
          for (; (uVar78 >> lVar84 & 1) == 0; lVar84 = lVar84 + 1) {
          }
        }
        uVar5 = *(undefined4 *)(uVar79 + 0x40 + lVar84 * 4);
        auVar157._4_4_ = uVar5;
        auVar157._0_4_ = uVar5;
        auVar157._8_4_ = uVar5;
        auVar157._12_4_ = uVar5;
        auVar157._16_4_ = uVar5;
        auVar157._20_4_ = uVar5;
        auVar157._24_4_ = uVar5;
        auVar157._28_4_ = uVar5;
        auVar68._8_8_ = uStack_2798;
        auVar68._0_8_ = local_27a0;
        auVar68._16_8_ = uStack_2790;
        auVar68._24_8_ = uStack_2788;
        auVar140 = vsubps_avx(auVar157,auVar68);
        auVar165._0_4_ = local_2800 * auVar140._0_4_;
        auVar165._4_4_ = fStack_27fc * auVar140._4_4_;
        auVar165._8_4_ = fStack_27f8 * auVar140._8_4_;
        auVar165._12_4_ = fStack_27f4 * auVar140._12_4_;
        auVar175._16_4_ = fStack_27f0 * auVar140._16_4_;
        auVar175._0_16_ = auVar165;
        auVar175._20_4_ = fStack_27ec * auVar140._20_4_;
        auVar175._28_36_ = auVar173._28_36_;
        auVar175._24_4_ = fStack_27e8 * auVar140._24_4_;
        uVar5 = *(undefined4 *)(uVar79 + 0x80 + lVar84 * 4);
        auVar158._4_4_ = uVar5;
        auVar158._0_4_ = uVar5;
        auVar158._8_4_ = uVar5;
        auVar158._12_4_ = uVar5;
        auVar158._16_4_ = uVar5;
        auVar158._20_4_ = uVar5;
        auVar158._24_4_ = uVar5;
        auVar158._28_4_ = uVar5;
        auVar66._8_8_ = uStack_27b8;
        auVar66._0_8_ = local_27c0;
        auVar66._16_8_ = uStack_27b0;
        auVar66._24_8_ = uStack_27a8;
        auVar140 = vsubps_avx(auVar158,auVar66);
        auVar179._0_4_ = local_2820 * auVar140._0_4_;
        auVar179._4_4_ = fStack_281c * auVar140._4_4_;
        auVar179._8_4_ = fStack_2818 * auVar140._8_4_;
        auVar179._12_4_ = fStack_2814 * auVar140._12_4_;
        auVar184._16_4_ = fStack_2810 * auVar140._16_4_;
        auVar184._0_16_ = auVar179;
        auVar184._20_4_ = fStack_280c * auVar140._20_4_;
        auVar184._28_36_ = auVar182._28_36_;
        auVar184._24_4_ = fStack_2808 * auVar140._24_4_;
        uVar5 = *(undefined4 *)(uVar79 + 0xc0 + lVar84 * 4);
        auVar159._4_4_ = uVar5;
        auVar159._0_4_ = uVar5;
        auVar159._8_4_ = uVar5;
        auVar159._12_4_ = uVar5;
        auVar159._16_4_ = uVar5;
        auVar159._20_4_ = uVar5;
        auVar159._24_4_ = uVar5;
        auVar159._28_4_ = uVar5;
        auVar64._8_8_ = uStack_27d8;
        auVar64._0_8_ = local_27e0;
        auVar64._16_8_ = uStack_27d0;
        auVar64._24_8_ = uStack_27c8;
        auVar140 = vsubps_avx(auVar159,auVar64);
        auVar154._0_4_ = local_2840 * auVar140._0_4_;
        auVar154._4_4_ = fStack_283c * auVar140._4_4_;
        auVar154._8_4_ = fStack_2838 * auVar140._8_4_;
        auVar154._12_4_ = fStack_2834 * auVar140._12_4_;
        auVar27._16_4_ = fStack_2830 * auVar140._16_4_;
        auVar27._0_16_ = auVar154;
        auVar27._20_4_ = fStack_282c * auVar140._20_4_;
        auVar27._24_4_ = fStack_2828 * auVar140._24_4_;
        auVar27._28_4_ = auVar140._28_4_;
        uVar5 = *(undefined4 *)(uVar79 + 0x60 + lVar84 * 4);
        auVar203._4_4_ = uVar5;
        auVar203._0_4_ = uVar5;
        auVar203._8_4_ = uVar5;
        auVar203._12_4_ = uVar5;
        auVar203._16_4_ = uVar5;
        auVar203._20_4_ = uVar5;
        auVar203._24_4_ = uVar5;
        auVar203._28_4_ = uVar5;
        auVar140 = vsubps_avx(auVar203,auVar68);
        auVar200._0_4_ = local_2800 * auVar140._0_4_;
        auVar200._4_4_ = fStack_27fc * auVar140._4_4_;
        auVar200._8_4_ = fStack_27f8 * auVar140._8_4_;
        auVar200._12_4_ = fStack_27f4 * auVar140._12_4_;
        auVar28._16_4_ = fStack_27f0 * auVar140._16_4_;
        auVar28._0_16_ = auVar200;
        auVar28._20_4_ = fStack_27ec * auVar140._20_4_;
        auVar28._24_4_ = fStack_27e8 * auVar140._24_4_;
        auVar28._28_4_ = auVar140._28_4_;
        uVar5 = *(undefined4 *)(uVar79 + 0xa0 + lVar84 * 4);
        auVar209._4_4_ = uVar5;
        auVar209._0_4_ = uVar5;
        auVar209._8_4_ = uVar5;
        auVar209._12_4_ = uVar5;
        auVar209._16_4_ = uVar5;
        auVar209._20_4_ = uVar5;
        auVar209._24_4_ = uVar5;
        auVar209._28_4_ = uVar5;
        auVar140 = vsubps_avx(auVar209,auVar66);
        auVar208._0_4_ = local_2820 * auVar140._0_4_;
        auVar208._4_4_ = fStack_281c * auVar140._4_4_;
        auVar208._8_4_ = fStack_2818 * auVar140._8_4_;
        auVar208._12_4_ = fStack_2814 * auVar140._12_4_;
        auVar29._16_4_ = fStack_2810 * auVar140._16_4_;
        auVar29._0_16_ = auVar208;
        auVar29._20_4_ = fStack_280c * auVar140._20_4_;
        auVar29._24_4_ = fStack_2808 * auVar140._24_4_;
        auVar29._28_4_ = auVar140._28_4_;
        uVar5 = *(undefined4 *)(uVar79 + 0xe0 + lVar84 * 4);
        auVar219._4_4_ = uVar5;
        auVar219._0_4_ = uVar5;
        auVar219._8_4_ = uVar5;
        auVar219._12_4_ = uVar5;
        auVar219._16_4_ = uVar5;
        auVar219._20_4_ = uVar5;
        auVar219._24_4_ = uVar5;
        auVar219._28_4_ = uVar5;
        auVar140 = vsubps_avx(auVar219,auVar64);
        auVar218._0_4_ = local_2840 * auVar140._0_4_;
        auVar218._4_4_ = fStack_283c * auVar140._4_4_;
        auVar218._8_4_ = fStack_2838 * auVar140._8_4_;
        auVar218._12_4_ = fStack_2834 * auVar140._12_4_;
        auVar30._16_4_ = fStack_2830 * auVar140._16_4_;
        auVar30._0_16_ = auVar218;
        auVar30._20_4_ = fStack_282c * auVar140._20_4_;
        auVar30._24_4_ = fStack_2828 * auVar140._24_4_;
        auVar30._28_4_ = auVar140._28_4_;
        auVar166 = vpmaxsd_avx(auVar175._16_16_,auVar28._16_16_);
        auVar85 = vpmaxsd_avx(auVar165,auVar200);
        auVar153 = auVar29._16_16_;
        auVar248 = ZEXT1664(auVar153);
        auVar138 = vpmaxsd_avx(auVar184._16_16_,auVar153);
        auVar138 = vpminsd_avx(auVar166,auVar138);
        auVar166 = vpmaxsd_avx(auVar179,auVar208);
        auVar85 = vpminsd_avx(auVar85,auVar166);
        auVar166 = vpmaxsd_avx(auVar154,auVar218);
        auVar166 = vpminsd_avx(auVar166,local_2a20._0_16_);
        auVar11 = vpminsd_avx(auVar85,auVar166);
        auVar166 = vpmaxsd_avx(auVar27._16_16_,auVar30._16_16_);
        auVar166 = vpminsd_avx(auVar166,local_29e0._0_16_);
        auVar12 = vpminsd_avx(auVar138,auVar166);
        auVar166 = vpminsd_avx(auVar165,auVar200);
        auVar85 = vpminsd_avx(auVar175._16_16_,auVar28._16_16_);
        auVar138 = vpminsd_avx(auVar179,auVar208);
        auVar166 = vpmaxsd_avx(auVar166,auVar138);
        auVar138 = vpminsd_avx(auVar184._16_16_,auVar153);
        auVar85 = vpmaxsd_avx(auVar85,auVar138);
        auVar173 = ZEXT1664(auVar85);
        auVar138 = vpminsd_avx(auVar27._16_16_,auVar30._16_16_);
        auVar153 = vpminsd_avx(auVar154,auVar218);
        auVar182 = ZEXT1664(local_23c0._16_16_);
        auVar138 = vpmaxsd_avx(auVar138,local_23c0._16_16_);
        auVar85 = vpmaxsd_avx(auVar85,auVar138);
        auVar138 = vpmaxsd_avx(auVar153,local_23c0._0_16_);
        auVar251 = ZEXT1664(auVar138);
        auVar166 = vpmaxsd_avx(auVar166,auVar138);
        auVar87._16_16_ = auVar85;
        auVar87._0_16_ = auVar166;
        auVar119._16_16_ = auVar12;
        auVar119._0_16_ = auVar11;
        auVar140 = vcmpps_avx(auVar87,auVar119,2);
        uVar81 = uVar80;
        if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar140 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar140 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar140 >> 0x7f,0) != '\0') ||
              (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar140 >> 0xbf,0) != '\0') ||
            (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar140[0x1f] < '\0') {
          uVar5 = *(undefined4 *)(local_2780 + lVar84 * 4);
          auVar138._4_4_ = uVar5;
          auVar138._0_4_ = uVar5;
          auVar138._8_4_ = uVar5;
          auVar138._12_4_ = uVar5;
          auVar160._16_4_ = uVar5;
          auVar160._0_16_ = auVar138;
          auVar160._20_4_ = uVar5;
          auVar160._24_4_ = uVar5;
          auVar160._28_4_ = uVar5;
          auVar251 = ZEXT3264(auVar160);
          uVar81 = *(ulong *)(uVar79 + lVar84 * 8);
          auVar140 = vcmpps_avx(auVar160,auVar144._0_32_,1);
          if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar140 >> 0x7f,0) == '\0') &&
                (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar140 >> 0xbf,0) == '\0') &&
              (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar140[0x1f]) {
            *puVar82 = uVar81;
            uVar81 = uVar80;
          }
          else {
            if (uVar80 == 8) {
              auVar144 = ZEXT3264(auVar160);
              goto LAB_0046142f;
            }
            *puVar82 = uVar80;
            auVar138 = auVar144._0_16_;
            auVar144 = ZEXT3264(auVar160);
          }
          auVar173 = ZEXT1664(auVar138);
          uVar77 = uVar77 + 1;
          *(int *)(puVar82 + 1) = auVar138._0_4_;
          puVar82 = puVar82 + 2;
        }
LAB_0046142f:
        uVar78 = uVar78 & uVar78 - 1;
        uVar80 = uVar81;
      } while (uVar78 != 0);
      if (uVar81 == 8) break;
      uVar79 = uVar81;
      if (1 < uVar77) {
        puVar1 = puVar82 + -4;
        puVar2 = puVar82 + -2;
        if ((uint)puVar82[-3] < (uint)puVar82[-1]) {
          uVar80 = *puVar1;
          uVar78 = puVar82[-3];
          *(int *)(puVar82 + -3) = (int)puVar82[-1];
          *puVar1 = *puVar2;
          *puVar2 = uVar80;
          local_2b00.geometryUserPtr._0_4_ = (undefined4)uVar78;
          *(undefined4 *)(puVar82 + -1) = local_2b00.geometryUserPtr._0_4_;
        }
        if (uVar77 != 2) {
          puVar3 = puVar82 + -6;
          uVar76 = (uint)puVar82[-5];
          if (uVar76 < (uint)puVar82[-1]) {
            uVar80 = *puVar3;
            uVar77 = puVar82[-5];
            *(int *)(puVar82 + -5) = (int)puVar82[-1];
            *puVar3 = *puVar2;
            *puVar2 = uVar80;
            local_2b00.geometryUserPtr._0_4_ = (undefined4)uVar77;
            *(undefined4 *)(puVar82 + -1) = local_2b00.geometryUserPtr._0_4_;
            uVar76 = (uint)puVar82[-5];
          }
          if (uVar76 < (uint)puVar82[-3]) {
            uVar80 = *puVar3;
            uVar77 = puVar82[-5];
            *(int *)(puVar82 + -5) = (int)puVar82[-3];
            *puVar3 = *puVar1;
            *puVar1 = uVar80;
            local_2b00.geometryUserPtr._0_4_ = (undefined4)uVar77;
            *(undefined4 *)(puVar82 + -3) = local_2b00.geometryUserPtr._0_4_;
          }
        }
      }
    }
    auVar251 = ZEXT3264(local_2960);
    if (puVar82 == &local_23a0) goto LAB_00462524;
  }
  auVar251 = ZEXT3264(local_2960);
  goto LAB_004624cc;
LAB_0046156a:
  do {
    local_2998 = local_2ad0 * 0xe0 + (uVar79 & 0xfffffffffffffff0);
    lVar83 = 0;
    do {
      uVar76 = *(uint *)(lVar84 + lVar83 * 4);
      if ((ulong)uVar76 == 0xffffffff) break;
      fVar118 = *(float *)(lVar84 + -0xc0 + lVar83 * 4);
      auVar88._4_4_ = fVar118;
      auVar88._0_4_ = fVar118;
      auVar88._8_4_ = fVar118;
      auVar88._12_4_ = fVar118;
      auVar88._16_4_ = fVar118;
      auVar88._20_4_ = fVar118;
      auVar88._24_4_ = fVar118;
      auVar88._28_4_ = fVar118;
      fVar112 = *(float *)(lVar84 + -0xb0 + lVar83 * 4);
      auVar120._4_4_ = fVar112;
      auVar120._0_4_ = fVar112;
      auVar120._8_4_ = fVar112;
      auVar120._12_4_ = fVar112;
      auVar120._16_4_ = fVar112;
      auVar120._20_4_ = fVar112;
      auVar120._24_4_ = fVar112;
      auVar120._28_4_ = fVar112;
      fVar113 = *(float *)(lVar84 + -0xa0 + lVar83 * 4);
      auVar132._4_4_ = fVar113;
      auVar132._0_4_ = fVar113;
      auVar132._8_4_ = fVar113;
      auVar132._12_4_ = fVar113;
      auVar132._16_4_ = fVar113;
      auVar132._20_4_ = fVar113;
      auVar132._24_4_ = fVar113;
      auVar132._28_4_ = fVar113;
      local_2880._4_4_ = *(float *)(lVar84 + -0x90 + lVar83 * 4);
      local_28a0._4_4_ = *(float *)(lVar84 + -0x80 + lVar83 * 4);
      local_28c0._4_4_ = *(float *)(lVar84 + -0x70 + lVar83 * 4);
      local_2a20._4_4_ = *(undefined4 *)(lVar84 + -0x60 + lVar83 * 4);
      local_2a20._0_4_ = local_2a20._4_4_;
      local_2a20._8_4_ = local_2a20._4_4_;
      local_2a20._12_4_ = local_2a20._4_4_;
      local_2a20._16_4_ = local_2a20._4_4_;
      local_2a20._20_4_ = local_2a20._4_4_;
      local_2a20._24_4_ = local_2a20._4_4_;
      local_2a20._28_4_ = local_2a20._4_4_;
      local_2a40._4_4_ = *(undefined4 *)(lVar84 + -0x50 + lVar83 * 4);
      local_2a40._0_4_ = local_2a40._4_4_;
      local_2a40._8_4_ = local_2a40._4_4_;
      uStack_2a34 = local_2a40._4_4_;
      uStack_2a30 = local_2a40._4_4_;
      uStack_2a2c = local_2a40._4_4_;
      uStack_2a28 = local_2a40._4_4_;
      uStack_2a24 = local_2a40._4_4_;
      local_2580 = *(undefined4 *)(lVar84 + -0x40 + lVar83 * 4);
      uStack_257c = local_2580;
      uStack_2578 = local_2580;
      uStack_2574 = local_2580;
      uStack_2570 = local_2580;
      uStack_256c = local_2580;
      uStack_2568 = local_2580;
      uStack_2564 = local_2580;
      local_25a0 = *(float *)(lVar84 + -0x30 + lVar83 * 4);
      local_25c0 = *(float *)(lVar84 + -0x20 + lVar83 * 4);
      local_25e0 = *(float *)(lVar84 + -0x10 + lVar83 * 4);
      local_28f0 = *(undefined8 *)(local_2998 + 0xd0);
      uStack_28e8 = *(undefined8 *)(local_2998 + 0xd8);
      local_28a0._0_4_ = local_28a0._4_4_;
      fStack_2898 = (float)local_28a0._4_4_;
      fStack_2894 = (float)local_28a0._4_4_;
      fStack_2890 = (float)local_28a0._4_4_;
      fStack_288c = (float)local_28a0._4_4_;
      fStack_2888 = (float)local_28a0._4_4_;
      fStack_2884 = (float)local_28a0._4_4_;
      fVar114 = fVar112 - (float)local_28a0._4_4_;
      local_28c0._0_4_ = local_28c0._4_4_;
      fStack_28b8 = (float)local_28c0._4_4_;
      fStack_28b4 = (float)local_28c0._4_4_;
      fStack_28b0 = (float)local_28c0._4_4_;
      fStack_28ac = (float)local_28c0._4_4_;
      fStack_28a8 = (float)local_28c0._4_4_;
      fStack_28a4 = (float)local_28c0._4_4_;
      fVar115 = fVar113 - (float)local_28c0._4_4_;
      fStack_25bc = local_25c0;
      fStack_25b8 = local_25c0;
      fStack_25b4 = local_25c0;
      fStack_25b0 = local_25c0;
      fStack_25ac = local_25c0;
      fStack_25a8 = local_25c0;
      fStack_25a4 = local_25c0;
      fVar112 = local_25c0 - fVar112;
      fStack_25dc = local_25e0;
      fStack_25d8 = local_25e0;
      fStack_25d4 = local_25e0;
      fStack_25d0 = local_25e0;
      fStack_25cc = local_25e0;
      fStack_25c8 = local_25e0;
      fStack_25c4 = local_25e0;
      fVar113 = local_25e0 - fVar113;
      local_2880._0_4_ = local_2880._4_4_;
      fStack_2878 = (float)local_2880._4_4_;
      fStack_2874 = (float)local_2880._4_4_;
      fStack_2870 = (float)local_2880._4_4_;
      fStack_286c = (float)local_2880._4_4_;
      fStack_2868 = (float)local_2880._4_4_;
      fStack_2864 = (float)local_2880._4_4_;
      fVar117 = fVar118 - (float)local_2880._4_4_;
      fStack_259c = local_25a0;
      fStack_2598 = local_25a0;
      fStack_2594 = local_25a0;
      fStack_2590 = local_25a0;
      fStack_258c = local_25a0;
      fStack_2588 = local_25a0;
      fStack_2584 = local_25a0;
      fVar118 = local_25a0 - fVar118;
      local_2aa0._8_8_ = 0;
      auVar140 = vsubps_avx(auVar120,*(undefined1 (*) [32])(ray + 0x20));
      auStack_2918 = auVar140._8_24_;
      auVar9 = vsubps_avx(auVar132,*(undefined1 (*) [32])(ray + 0x40));
      auStack_2938 = auVar9._8_24_;
      fVar116 = *(float *)(ray + 0xa0);
      fVar206 = *(float *)(ray + 0xa4);
      fVar111 = *(float *)(ray + 0xa8);
      fVar13 = *(float *)(ray + 0xac);
      fVar14 = *(float *)(ray + 0xb0);
      fVar15 = *(float *)(ray + 0xb4);
      fVar16 = *(float *)(ray + 0xb8);
      fVar17 = *(float *)(ray + 0xc0);
      fVar18 = *(float *)(ray + 0xc4);
      fVar19 = *(float *)(ray + 200);
      fVar20 = *(float *)(ray + 0xcc);
      fVar21 = *(float *)(ray + 0xd0);
      fVar22 = *(float *)(ray + 0xd4);
      fVar23 = *(float *)(ray + 0xd8);
      fVar187 = auVar9._0_4_;
      fVar190 = auVar9._4_4_;
      auVar31._4_4_ = fVar190 * fVar206;
      auVar31._0_4_ = fVar187 * fVar116;
      fVar193 = auVar9._8_4_;
      auVar31._8_4_ = fVar193 * fVar111;
      fVar195 = auVar9._12_4_;
      auVar31._12_4_ = fVar195 * fVar13;
      fVar197 = auVar9._16_4_;
      auVar31._16_4_ = fVar197 * fVar14;
      fVar198 = auVar9._20_4_;
      auVar31._20_4_ = fVar198 * fVar15;
      fVar207 = auVar9._24_4_;
      auVar31._24_4_ = fVar207 * fVar16;
      auVar31._28_4_ = local_2880._4_4_;
      fVar176 = auVar140._0_4_;
      auVar173._0_4_ = fVar176 * fVar17;
      fVar185 = auVar140._4_4_;
      auVar173._4_4_ = fVar185 * fVar18;
      fVar188 = auVar140._8_4_;
      auVar173._8_4_ = fVar188 * fVar19;
      fVar191 = auVar140._12_4_;
      auVar173._12_4_ = fVar191 * fVar20;
      fVar194 = auVar140._16_4_;
      auVar173._16_4_ = fVar194 * fVar21;
      fVar196 = auVar140._20_4_;
      auVar173._20_4_ = fVar196 * fVar22;
      fVar137 = auVar140._24_4_;
      auVar173._28_36_ = auVar248._28_36_;
      auVar173._24_4_ = fVar137 * fVar23;
      auVar86 = vsubps_avx(auVar173._0_32_,auVar31);
      auVar139 = vsubps_avx(auVar88,*(undefined1 (*) [32])ray);
      fVar24 = *(float *)(ray + 0x80);
      fVar37 = *(float *)(ray + 0x84);
      fVar55 = *(float *)(ray + 0x88);
      fVar56 = *(float *)(ray + 0x8c);
      fVar57 = *(float *)(ray + 0x90);
      fVar58 = *(float *)(ray + 0x94);
      fVar59 = *(float *)(ray + 0x98);
      fVar146 = auVar139._0_4_;
      fVar147 = auVar139._4_4_;
      auVar32._4_4_ = fVar147 * fVar18;
      auVar32._0_4_ = fVar146 * fVar17;
      fVar148 = auVar139._8_4_;
      auVar32._8_4_ = fVar148 * fVar19;
      fVar149 = auVar139._12_4_;
      auVar32._12_4_ = fVar149 * fVar20;
      fVar150 = auVar139._16_4_;
      auVar32._16_4_ = fVar150 * fVar21;
      fVar151 = auVar139._20_4_;
      auVar32._20_4_ = fVar151 * fVar22;
      fVar178 = auVar139._24_4_;
      auVar32._24_4_ = fVar178 * fVar23;
      auVar32._28_4_ = auVar248._28_4_;
      auVar33._4_4_ = fVar190 * fVar37;
      auVar33._0_4_ = fVar187 * fVar24;
      auVar33._8_4_ = fVar193 * fVar55;
      auVar33._12_4_ = fVar195 * fVar56;
      auVar33._16_4_ = fVar197 * fVar57;
      auVar33._20_4_ = fVar198 * fVar58;
      auVar33._24_4_ = fVar207 * fVar59;
      auVar33._28_4_ = auVar9._28_4_;
      auVar139 = vsubps_avx(auVar33,auVar32);
      auVar249 = ZEXT436(auVar139._28_4_);
      auVar34._4_4_ = fVar185 * fVar37;
      auVar34._0_4_ = fVar176 * fVar24;
      auVar34._8_4_ = fVar188 * fVar55;
      auVar34._12_4_ = fVar191 * fVar56;
      auVar34._16_4_ = fVar194 * fVar57;
      auVar34._20_4_ = fVar196 * fVar58;
      auVar34._24_4_ = fVar137 * fVar59;
      auVar34._28_4_ = auVar9._28_4_;
      auVar9._4_4_ = fVar147 * fVar206;
      auVar9._0_4_ = fVar146 * fVar116;
      auVar9._8_4_ = fVar148 * fVar111;
      auVar9._12_4_ = fVar149 * fVar13;
      auVar9._16_4_ = fVar150 * fVar14;
      auVar9._20_4_ = fVar151 * fVar15;
      auVar9._24_4_ = fVar178 * fVar16;
      auVar9._28_4_ = auVar140._28_4_;
      auVar9 = vsubps_avx(auVar9,auVar34);
      auVar166 = ZEXT416((uint)(fVar117 * fVar113 - fVar118 * fVar115));
      auVar166 = vshufps_avx(auVar166,auVar166,0);
      local_2760._16_16_ = auVar166;
      local_2760._0_16_ = auVar166;
      auVar85 = ZEXT416((uint)(fVar114 * fVar118 - fVar117 * fVar112));
      auVar85 = vshufps_avx(auVar85,auVar85,0);
      local_2740._16_16_ = auVar85;
      local_2740._0_16_ = auVar85;
      fVar152 = auVar85._0_4_;
      fVar163 = auVar85._4_4_;
      fVar164 = auVar85._8_4_;
      fVar177 = auVar166._0_4_;
      fVar186 = auVar166._4_4_;
      fVar189 = auVar166._8_4_;
      fVar192 = auVar166._12_4_;
      auVar166 = ZEXT416((uint)(fVar115 * fVar112 - fVar114 * fVar113));
      auVar166 = vshufps_avx(auVar166,auVar166,0);
      auVar133._16_16_ = auVar166;
      auVar133._0_16_ = auVar166;
      fVar130 = auVar166._0_4_;
      fVar135 = auVar166._4_4_;
      fVar136 = auVar166._8_4_;
      auVar204._0_4_ = fVar130 * fVar24 + fVar177 * fVar116 + fVar152 * fVar17;
      auVar204._4_4_ = fVar135 * fVar37 + fVar186 * fVar206 + fVar163 * fVar18;
      auVar204._8_4_ = fVar136 * fVar55 + fVar189 * fVar111 + fVar164 * fVar19;
      auVar204._12_4_ = auVar166._12_4_ * fVar56 + fVar192 * fVar13 + auVar85._12_4_ * fVar20;
      auVar204._16_4_ = fVar130 * fVar57 + fVar177 * fVar14 + fVar152 * fVar21;
      auVar204._20_4_ = fVar135 * fVar58 + fVar186 * fVar15 + fVar163 * fVar22;
      auVar204._24_4_ = fVar136 * fVar59 + fVar189 * fVar16 + fVar164 * fVar23;
      auVar204._28_4_ = *(float *)(ray + 0x9c) + *(float *)(ray + 0xbc) + *(float *)(ray + 0xdc);
      auVar138 = vshufps_avx(ZEXT416((uint)fVar112),ZEXT416((uint)fVar112),0);
      auVar11 = vshufps_avx(ZEXT416((uint)fVar113),ZEXT416((uint)fVar113),0);
      auVar12 = vshufps_avx(ZEXT416((uint)fVar118),ZEXT416((uint)fVar118),0);
      auVar244 = ZEXT436(auVar86._28_4_);
      auVar121._8_4_ = 0x80000000;
      auVar121._0_8_ = 0x8000000080000000;
      auVar121._12_4_ = 0x80000000;
      auVar121._16_4_ = 0x80000000;
      auVar121._20_4_ = 0x80000000;
      auVar121._24_4_ = 0x80000000;
      auVar121._28_4_ = 0x80000000;
      auVar129 = ZEXT436(0x80000000);
      auVar140 = vandps_avx(auVar204,auVar121);
      uVar230 = auVar140._0_4_;
      auVar142._0_4_ =
           (float)(uVar230 ^
                  (uint)(auVar12._0_4_ * auVar86._0_4_ +
                        auVar139._0_4_ * auVar138._0_4_ + auVar9._0_4_ * auVar11._0_4_));
      uVar232 = auVar140._4_4_;
      auVar142._4_4_ =
           (float)(uVar232 ^
                  (uint)(auVar12._4_4_ * auVar86._4_4_ +
                        auVar139._4_4_ * auVar138._4_4_ + auVar9._4_4_ * auVar11._4_4_));
      uVar234 = auVar140._8_4_;
      auVar142._8_4_ =
           (float)(uVar234 ^
                  (uint)(auVar12._8_4_ * auVar86._8_4_ +
                        auVar139._8_4_ * auVar138._8_4_ + auVar9._8_4_ * auVar11._8_4_));
      uVar236 = auVar140._12_4_;
      auVar142._12_4_ =
           (float)(uVar236 ^
                  (uint)(auVar12._12_4_ * auVar86._12_4_ +
                        auVar139._12_4_ * auVar138._12_4_ + auVar9._12_4_ * auVar11._12_4_));
      uVar238 = auVar140._16_4_;
      auVar142._16_4_ =
           (float)(uVar238 ^
                  (uint)(auVar12._0_4_ * auVar86._16_4_ +
                        auVar139._16_4_ * auVar138._0_4_ + auVar9._16_4_ * auVar11._0_4_));
      uVar240 = auVar140._20_4_;
      auVar142._20_4_ =
           (float)(uVar240 ^
                  (uint)(auVar12._4_4_ * auVar86._20_4_ +
                        auVar139._20_4_ * auVar138._4_4_ + auVar9._20_4_ * auVar11._4_4_));
      uVar241 = auVar140._24_4_;
      auVar142._24_4_ =
           (float)(uVar241 ^
                  (uint)(auVar12._8_4_ * auVar86._24_4_ +
                        auVar139._24_4_ * auVar138._8_4_ + auVar9._24_4_ * auVar11._8_4_));
      uVar243 = auVar140._28_4_;
      auVar142._28_4_ = uVar243 ^ (uint)(auVar12._12_4_ + auVar138._12_4_ + auVar11._12_4_);
      auVar140 = vcmpps_avx(auVar142,ZEXT432(0) << 0x20,5);
      auVar245 = ZEXT436(auVar140._28_4_);
      auVar167 = local_29e0 & auVar140;
      uVar75 = 0;
      local_2b00.ray = (RTCRayN *)ray;
      if ((((((((auVar167 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar167 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar167 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar167 >> 0x7f,0) != '\0') ||
            (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar167 >> 0xbf,0) != '\0') ||
          (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar167[0x1f] < '\0') {
        auVar11 = vshufps_avx(ZEXT416((uint)fVar117),ZEXT416((uint)fVar117),0);
        auVar12 = vshufps_avx(ZEXT416((uint)fVar114),ZEXT416((uint)fVar114),0);
        auVar153 = vpermilps_avx(ZEXT416((uint)fVar115),0);
        auVar140 = vandps_avx(auVar140,local_29e0);
        auVar138 = vpackssdw_avx(auVar140._0_16_,auVar140._16_16_);
        fVar118 = auVar153._12_4_;
        auVar171._0_4_ =
             (float)(uVar230 ^
                    (uint)(auVar86._0_4_ * auVar11._0_4_ +
                          auVar139._0_4_ * auVar12._0_4_ + auVar9._0_4_ * auVar153._0_4_));
        auVar171._4_4_ =
             (float)(uVar232 ^
                    (uint)(auVar86._4_4_ * auVar11._4_4_ +
                          auVar139._4_4_ * auVar12._4_4_ + auVar9._4_4_ * auVar153._4_4_));
        auVar171._8_4_ =
             (float)(uVar234 ^
                    (uint)(auVar86._8_4_ * auVar11._8_4_ +
                          auVar139._8_4_ * auVar12._8_4_ + auVar9._8_4_ * auVar153._8_4_));
        auVar171._12_4_ =
             (float)(uVar236 ^
                    (uint)(auVar86._12_4_ * auVar11._12_4_ +
                          auVar139._12_4_ * auVar12._12_4_ + auVar9._12_4_ * fVar118));
        auVar171._16_4_ =
             (float)(uVar238 ^
                    (uint)(auVar86._16_4_ * auVar11._0_4_ +
                          auVar139._16_4_ * auVar12._0_4_ + auVar9._16_4_ * auVar153._0_4_));
        auVar171._20_4_ =
             (float)(uVar240 ^
                    (uint)(auVar86._20_4_ * auVar11._4_4_ +
                          auVar139._20_4_ * auVar12._4_4_ + auVar9._20_4_ * auVar153._4_4_));
        auVar171._24_4_ =
             (float)(uVar241 ^
                    (uint)(auVar86._24_4_ * auVar11._8_4_ +
                          auVar139._24_4_ * auVar12._8_4_ + auVar9._24_4_ * auVar153._8_4_));
        auVar171._28_4_ = uVar243 ^ (uint)(auVar11._12_4_ + auVar12._12_4_ + fVar118);
        auVar140 = vcmpps_avx(auVar171,_DAT_01faff00,5);
        auVar11 = vpackssdw_avx(auVar140._0_16_,auVar140._16_16_);
        auVar138 = vpand_avx(auVar138,auVar11);
        auVar11 = vpmovsxwd_avx(auVar138);
        auVar12 = vpunpckhwd_avx(auVar138,auVar138);
        auVar129 = (undefined1  [36])0x0;
        auVar89._16_16_ = auVar12;
        auVar89._0_16_ = auVar11;
        uVar75 = local_2aa0._8_8_;
        if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar89 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar89 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar89 >> 0x7f,0) != '\0') ||
              (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar12 >> 0x3f,0) != '\0') ||
            (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar12[0xf] < '\0') {
          auVar90._8_4_ = 0x7fffffff;
          auVar90._0_8_ = 0x7fffffff7fffffff;
          auVar90._12_4_ = 0x7fffffff;
          auVar90._16_4_ = 0x7fffffff;
          auVar90._20_4_ = 0x7fffffff;
          auVar90._24_4_ = 0x7fffffff;
          auVar90._28_4_ = 0x7fffffff;
          auVar140 = vandps_avx(auVar204,auVar90);
          auVar245 = ZEXT436(auVar140._28_4_);
          auVar9 = vsubps_avx(auVar140,auVar142);
          auVar9 = vcmpps_avx(auVar9,auVar171,5);
          auVar11 = vpackssdw_avx(auVar9._0_16_,auVar9._16_16_);
          auVar138 = vpand_avx(auVar138,auVar11);
          auVar11 = vpmovsxwd_avx(auVar138);
          auVar12 = vpunpckhwd_avx(auVar138,auVar138);
          auVar129 = (undefined1  [36])0x0;
          auVar91._16_16_ = auVar12;
          auVar91._0_16_ = auVar11;
          if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar91 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar91 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar91 >> 0x7f,0) != '\0') ||
                (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar12 >> 0x3f,0) != '\0') ||
              (auVar91 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar12[0xf] < '\0') {
            fVar112 = fVar192 + fVar192 + auVar12._12_4_;
            auVar123._0_4_ =
                 (float)(uVar230 ^ (uint)(fVar130 * fVar146 + fVar177 * fVar176 + fVar152 * fVar187)
                        );
            auVar123._4_4_ =
                 (float)(uVar232 ^ (uint)(fVar135 * fVar147 + fVar186 * fVar185 + fVar163 * fVar190)
                        );
            auVar123._8_4_ =
                 (float)(uVar234 ^ (uint)(fVar136 * fVar148 + fVar189 * fVar188 + fVar164 * fVar193)
                        );
            auVar123._12_4_ =
                 (float)(uVar236 ^
                        (uint)(auVar166._12_4_ * fVar149 +
                              fVar192 * fVar191 + auVar85._12_4_ * fVar195));
            auVar123._16_4_ =
                 (float)(uVar238 ^ (uint)(fVar130 * fVar150 + fVar177 * fVar194 + fVar152 * fVar197)
                        );
            auVar123._20_4_ =
                 (float)(uVar240 ^ (uint)(fVar135 * fVar151 + fVar186 * fVar196 + fVar163 * fVar198)
                        );
            auVar123._24_4_ =
                 (float)(uVar241 ^ (uint)(fVar136 * fVar178 + fVar189 * fVar137 + fVar164 * fVar207)
                        );
            auVar123._28_4_ = uVar243 ^ (uint)fVar112;
            auVar129 = ZEXT436(auVar123._28_4_);
            fVar113 = auVar140._0_4_;
            fVar114 = auVar140._4_4_;
            auVar44._4_4_ = fVar114 * *(float *)(ray + 100);
            auVar44._0_4_ = fVar113 * *(float *)(ray + 0x60);
            fVar115 = auVar140._8_4_;
            auVar44._8_4_ = fVar115 * *(float *)(ray + 0x68);
            fVar117 = auVar140._12_4_;
            auVar44._12_4_ = fVar117 * *(float *)(ray + 0x6c);
            fVar116 = auVar140._16_4_;
            auVar44._16_4_ = fVar116 * *(float *)(ray + 0x70);
            fVar206 = auVar140._20_4_;
            auVar44._20_4_ = fVar206 * *(float *)(ray + 0x74);
            fVar111 = auVar140._24_4_;
            auVar44._24_4_ = fVar111 * *(float *)(ray + 0x78);
            auVar44._28_4_ = fVar112;
            auVar9 = vcmpps_avx(auVar44,auVar123,1);
            local_28e0 = *(undefined1 (*) [32])(ray + 0x100);
            auVar45._4_4_ = fVar114 * local_28e0._4_4_;
            auVar45._0_4_ = fVar113 * local_28e0._0_4_;
            auVar45._8_4_ = fVar115 * local_28e0._8_4_;
            auVar45._12_4_ = fVar117 * local_28e0._12_4_;
            auVar45._16_4_ = fVar116 * local_28e0._16_4_;
            auVar45._20_4_ = fVar206 * local_28e0._20_4_;
            auVar45._24_4_ = fVar111 * local_28e0._24_4_;
            auVar45._28_4_ = fVar118;
            auVar139 = vcmpps_avx(auVar123,auVar45,2);
            auVar9 = vandps_avx(auVar9,auVar139);
            auVar85 = vpackssdw_avx(auVar9._0_16_,auVar9._16_16_);
            auVar85 = vpand_avx(auVar138,auVar85);
            auVar138 = vpmovsxwd_avx(auVar85);
            auVar11 = vpshufd_avx(auVar85,0xee);
            auVar11 = vpmovsxwd_avx(auVar11);
            auVar92._16_16_ = auVar11;
            auVar92._0_16_ = auVar138;
            if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar92 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar92 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar92 >> 0x7f,0) != '\0') ||
                  (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar11 >> 0x3f,0) != '\0') ||
                (auVar92 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar11[0xf] < '\0') {
              auVar9 = vcmpps_avx(auVar204,_DAT_01faff00,4);
              auVar138 = vpackssdw_avx(auVar9._0_16_,auVar9._16_16_);
              auVar85 = vpand_avx(auVar85,auVar138);
              auVar138 = vpmovsxwd_avx(auVar85);
              auVar85 = vpunpckhwd_avx(auVar85,auVar85);
              auVar93._16_16_ = auVar85;
              auVar93._0_16_ = auVar138;
              if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar93 >> 0x7f,0) != '\0') ||
                    (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB161(auVar85 >> 0x3f,0) != '\0') ||
                  (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar85[0xf] < '\0') {
                pGVar6 = (context->scene->geometries).items[uVar76].ptr;
                uVar230 = pGVar6->mask;
                auVar94._4_4_ = uVar230;
                auVar94._0_4_ = uVar230;
                auVar94._8_4_ = uVar230;
                auVar94._12_4_ = uVar230;
                auVar94._16_4_ = uVar230;
                auVar94._20_4_ = uVar230;
                auVar94._24_4_ = uVar230;
                auVar94._28_4_ = uVar230;
                auVar9 = vandps_avx(auVar94,*(undefined1 (*) [32])(ray + 0x120));
                auVar11 = vpcmpeqd_avx(auVar9._16_16_,ZEXT416(0) << 0x20);
                auVar12 = vpcmpeqd_avx(auVar9._0_16_,ZEXT416(0) << 0x20);
                auVar134._16_16_ = auVar11;
                auVar134._0_16_ = auVar12;
                auVar9 = vblendps_avx(ZEXT1632(auVar12),auVar134,0xf0);
                auVar210._16_16_ = auVar85;
                auVar210._0_16_ = auVar138;
                auVar139 = auVar210 & ~auVar9;
                if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar139 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar139 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar139 >> 0x7f,0) != '\0') ||
                      (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar139 >> 0xbf,0) != '\0') ||
                    (auVar139 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar139[0x1f] < '\0') {
                  auVar249 = ZEXT436((uint)fVar192);
                  auVar167 = vrcpps_avx(auVar140);
                  fVar118 = auVar167._0_4_;
                  fVar112 = auVar167._4_4_;
                  auVar46._4_4_ = fVar114 * fVar112;
                  auVar46._0_4_ = fVar113 * fVar118;
                  fVar113 = auVar167._8_4_;
                  auVar46._8_4_ = fVar115 * fVar113;
                  fVar114 = auVar167._12_4_;
                  auVar46._12_4_ = fVar117 * fVar114;
                  fVar115 = auVar167._16_4_;
                  auVar46._16_4_ = fVar116 * fVar115;
                  fVar117 = auVar167._20_4_;
                  auVar46._20_4_ = fVar206 * fVar117;
                  fVar116 = auVar167._24_4_;
                  auVar46._24_4_ = fVar111 * fVar116;
                  auVar46._28_4_ = auVar11._12_4_;
                  auVar180._8_4_ = 0x3f800000;
                  auVar180._0_8_ = 0x3f8000003f800000;
                  auVar180._12_4_ = 0x3f800000;
                  auVar180._16_4_ = 0x3f800000;
                  auVar180._20_4_ = 0x3f800000;
                  auVar180._24_4_ = 0x3f800000;
                  auVar180._28_4_ = 0x3f800000;
                  auVar10 = vsubps_avx(auVar180,auVar46);
                  fVar118 = fVar118 + fVar118 * auVar10._0_4_;
                  fVar112 = fVar112 + fVar112 * auVar10._4_4_;
                  fVar113 = fVar113 + fVar113 * auVar10._8_4_;
                  fVar114 = fVar114 + fVar114 * auVar10._12_4_;
                  fVar115 = fVar115 + fVar115 * auVar10._16_4_;
                  fVar117 = fVar117 + fVar117 * auVar10._20_4_;
                  fVar116 = fVar116 + fVar116 * auVar10._24_4_;
                  auVar47._4_4_ = fVar112 * auVar123._4_4_;
                  auVar47._0_4_ = fVar118 * auVar123._0_4_;
                  auVar47._8_4_ = fVar113 * auVar123._8_4_;
                  auVar47._12_4_ = fVar114 * auVar123._12_4_;
                  auVar47._16_4_ = fVar115 * auVar123._16_4_;
                  auVar47._20_4_ = fVar117 * auVar123._20_4_;
                  auVar47._24_4_ = fVar116 * auVar123._24_4_;
                  auVar47._28_4_ = auVar123._28_4_;
                  auVar129 = ZEXT436(auVar123._28_4_);
                  auVar48._4_4_ = fVar112 * auVar142._4_4_;
                  auVar48._0_4_ = fVar118 * auVar142._0_4_;
                  auVar48._8_4_ = fVar113 * auVar142._8_4_;
                  auVar48._12_4_ = fVar114 * auVar142._12_4_;
                  auVar48._16_4_ = fVar115 * auVar142._16_4_;
                  auVar48._20_4_ = fVar117 * auVar142._20_4_;
                  auVar48._24_4_ = fVar116 * auVar142._24_4_;
                  auVar48._28_4_ = auVar10._28_4_;
                  auVar139 = vminps_avx(auVar48,auVar180);
                  auVar49._4_4_ = fVar112 * auVar171._4_4_;
                  auVar49._0_4_ = fVar118 * auVar171._0_4_;
                  auVar49._8_4_ = fVar113 * auVar171._8_4_;
                  auVar49._12_4_ = fVar114 * auVar171._12_4_;
                  auVar49._16_4_ = fVar115 * auVar171._16_4_;
                  auVar49._20_4_ = fVar117 * auVar171._20_4_;
                  auVar49._24_4_ = fVar116 * auVar171._24_4_;
                  auVar49._28_4_ = auVar167._28_4_ + auVar10._28_4_;
                  auVar167 = vminps_avx(auVar49,auVar180);
                  auVar10 = vsubps_avx(auVar180,auVar139);
                  auVar70._8_8_ = uStack_2638;
                  auVar70._0_8_ = local_2640;
                  auVar70._16_8_ = uStack_2630;
                  auVar70._24_8_ = uStack_2628;
                  local_2720 = vblendvps_avx(auVar139,auVar10,auVar70);
                  auVar139 = vsubps_avx(auVar180,auVar167);
                  local_2700 = vblendvps_avx(auVar167,auVar139,auVar70);
                  local_2ac0 = vandnps_avx(auVar9,auVar210);
                  auVar85 = ZEXT416(*(uint *)((long)&local_28f0 + lVar83 * 4));
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    auVar140 = vmaskmovps_avx(local_2ac0,auVar47);
                    *(undefined1 (*) [32])local_2940 = auVar140;
                    auVar140 = vmaskmovps_avx(local_2ac0,auVar133);
                    *(undefined1 (*) [32])local_2a48 = auVar140;
                    auVar140 = vmaskmovps_avx(local_2ac0,local_2760);
                    *(undefined1 (*) [32])local_2a50 = auVar140;
                    auVar140 = vmaskmovps_avx(local_2ac0,local_2740);
                    *(undefined1 (*) [32])local_2a58 = auVar140;
                    auVar140 = vmaskmovps_avx(local_2ac0,local_2720);
                    *(undefined1 (*) [32])local_2a60 = auVar140;
                    auVar140 = vmaskmovps_avx(local_2ac0,local_2700);
                    *(undefined1 (*) [32])local_2a68 = auVar140;
                    auVar166 = vpshufd_avx(auVar85,0);
                    auVar95._16_16_ = auVar166;
                    auVar95._0_16_ = auVar166;
                    auVar140 = vmaskmovps_avx(local_2ac0,auVar95);
                    *(undefined1 (*) [32])local_2a70 = auVar140;
                    auVar166 = vpshufd_avx(ZEXT416(uVar76),0);
                    auVar96._16_16_ = auVar166;
                    auVar96._0_16_ = auVar166;
                    auVar140 = vmaskmovps_avx(local_2ac0,auVar96);
                    *(undefined1 (*) [32])local_2a78 = auVar140;
                    uVar76 = context->user->instID[0];
                    auVar97._4_4_ = uVar76;
                    auVar97._0_4_ = uVar76;
                    auVar97._8_4_ = uVar76;
                    auVar97._12_4_ = uVar76;
                    auVar97._16_4_ = uVar76;
                    auVar97._20_4_ = uVar76;
                    auVar97._24_4_ = uVar76;
                    auVar97._28_4_ = uVar76;
                    auVar140 = vmaskmovps_avx(local_2ac0,auVar97);
                    *(undefined1 (*) [32])local_2a80 = auVar140;
                    uVar76 = context->user->instPrimID[0];
                    auVar98._4_4_ = uVar76;
                    auVar98._0_4_ = uVar76;
                    auVar98._8_4_ = uVar76;
                    auVar98._12_4_ = uVar76;
                    auVar98._16_4_ = uVar76;
                    auVar98._20_4_ = uVar76;
                    auVar98._24_4_ = uVar76;
                    auVar98._28_4_ = uVar76;
                    auVar140 = vmaskmovps_avx(local_2ac0,auVar98);
                    *(undefined1 (*) [32])local_2a88 = auVar140;
                  }
                  else {
                    local_2aa0._8_8_ = 0;
                    pRVar7 = context->user;
                    auStack_26b0 = vpshufd_avx(ZEXT416(uVar76),0);
                    auStack_26d0 = vpshufd_avx(auVar85,0);
                    local_2780[0] = (RTCHitN)auVar166[0];
                    local_2780[1] = (RTCHitN)auVar166[1];
                    local_2780[2] = (RTCHitN)auVar166[2];
                    local_2780[3] = (RTCHitN)auVar166[3];
                    local_2780[4] = (RTCHitN)auVar166[4];
                    local_2780[5] = (RTCHitN)auVar166[5];
                    local_2780[6] = (RTCHitN)auVar166[6];
                    local_2780[7] = (RTCHitN)auVar166[7];
                    local_2780[8] = (RTCHitN)auVar166[8];
                    local_2780[9] = (RTCHitN)auVar166[9];
                    local_2780[10] = (RTCHitN)auVar166[10];
                    local_2780[0xb] = (RTCHitN)auVar166[0xb];
                    local_2780[0xc] = (RTCHitN)auVar166[0xc];
                    local_2780[0xd] = (RTCHitN)auVar166[0xd];
                    local_2780[0xe] = (RTCHitN)auVar166[0xe];
                    local_2780[0xf] = (RTCHitN)auVar166[0xf];
                    local_2780[0x10] = (RTCHitN)auVar166[0];
                    local_2780[0x11] = (RTCHitN)auVar166[1];
                    local_2780[0x12] = (RTCHitN)auVar166[2];
                    local_2780[0x13] = (RTCHitN)auVar166[3];
                    local_2780[0x14] = (RTCHitN)auVar166[4];
                    local_2780[0x15] = (RTCHitN)auVar166[5];
                    local_2780[0x16] = (RTCHitN)auVar166[6];
                    local_2780[0x17] = (RTCHitN)auVar166[7];
                    local_2780[0x18] = (RTCHitN)auVar166[8];
                    local_2780[0x19] = (RTCHitN)auVar166[9];
                    local_2780[0x1a] = (RTCHitN)auVar166[10];
                    local_2780[0x1b] = (RTCHitN)auVar166[0xb];
                    local_2780[0x1c] = (RTCHitN)auVar166[0xc];
                    local_2780[0x1d] = (RTCHitN)auVar166[0xd];
                    local_2780[0x1e] = (RTCHitN)auVar166[0xe];
                    local_2780[0x1f] = (RTCHitN)auVar166[0xf];
                    local_26e0 = auStack_26d0;
                    local_26c0 = auStack_26b0;
                    auVar9 = vcmpps_avx(ZEXT1632(auStack_26b0),ZEXT1632(auStack_26b0),0xf);
                    local_2a90[1] = auVar9;
                    *local_2a90 = auVar9;
                    local_26a0 = pRVar7->instID[0];
                    uStack_269c = local_26a0;
                    uStack_2698 = local_26a0;
                    uStack_2694 = local_26a0;
                    uStack_2690 = local_26a0;
                    uStack_268c = local_26a0;
                    uStack_2688 = local_26a0;
                    uStack_2684 = local_26a0;
                    local_2680 = pRVar7->instPrimID[0];
                    uStack_267c = local_2680;
                    uStack_2678 = local_2680;
                    uStack_2674 = local_2680;
                    uStack_2670 = local_2680;
                    uStack_266c = local_2680;
                    uStack_2668 = local_2680;
                    uStack_2664 = local_2680;
                    auVar9 = vblendvps_avx(local_28e0,auVar47,local_2ac0);
                    *(undefined1 (*) [32])(ray + 0x100) = auVar9;
                    local_2b00.valid = (int *)local_2ac0;
                    local_2b00.geometryUserPtr = pGVar6->userPtr;
                    local_2b00.context = context->user;
                    local_2b00.hit = local_2780;
                    local_2b00.N = 8;
                    local_29a8 = pGVar6;
                    if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                      auVar244 = ZEXT436(auVar86._28_4_);
                      auVar245 = ZEXT436(auVar140._28_4_);
                      auVar249 = ZEXT436((uint)fVar192);
                    }
                    else {
                      auVar244 = (undefined1  [36])0x0;
                      auVar245 = (undefined1  [36])0x0;
                      auVar249 = (undefined1  [36])0x0;
                      (*pGVar6->intersectionFilterN)(&local_2b00);
                    }
                    auVar166 = vpcmpeqd_avx(local_2ac0._0_16_,(undefined1  [16])0x0);
                    auVar85 = vpcmpeqd_avx(local_2ac0._16_16_,(undefined1  [16])0x0);
                    auVar125._16_16_ = auVar85;
                    auVar125._0_16_ = auVar166;
                    auVar140 = _DAT_01fe9960 & ~auVar125;
                    if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar140 >> 0x7f,0) == '\0') &&
                          (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar140 >> 0xbf,0) == '\0') &&
                        (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar140[0x1f]) {
                      auVar109._0_8_ = auVar166._0_8_ ^ 0xffffffffffffffff;
                      auVar109._8_4_ = auVar166._8_4_ ^ 0xffffffff;
                      auVar109._12_4_ = auVar166._12_4_ ^ 0xffffffff;
                      auVar109._16_4_ = auVar85._0_4_ ^ 0xffffffff;
                      auVar109._20_4_ = auVar85._4_4_ ^ 0xffffffff;
                      auVar109._24_4_ = auVar85._8_4_ ^ 0xffffffff;
                      auVar109._28_4_ = auVar85._12_4_ ^ 0xffffffff;
                    }
                    else {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_29a8->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar244 = (undefined1  [36])0x0;
                        auVar245 = (undefined1  [36])0x0;
                        auVar249 = (undefined1  [36])0x0;
                        (*p_Var8)(&local_2b00);
                      }
                      auVar166 = vpcmpeqd_avx(local_2ac0._0_16_,(undefined1  [16])0x0);
                      auVar85 = vpcmpeqd_avx(local_2ac0._16_16_,(undefined1  [16])0x0);
                      auVar127._16_16_ = auVar85;
                      auVar127._0_16_ = auVar166;
                      auVar140 = vcmpps_avx(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                            SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xf);
                      auVar109._0_4_ = auVar166._0_4_ ^ auVar140._0_4_;
                      auVar109._4_4_ = auVar166._4_4_ ^ auVar140._4_4_;
                      auVar109._8_4_ = auVar166._8_4_ ^ auVar140._8_4_;
                      auVar109._12_4_ = auVar166._12_4_ ^ auVar140._12_4_;
                      auVar109._16_4_ = auVar85._0_4_ ^ auVar140._16_4_;
                      auVar109._20_4_ = auVar85._4_4_ ^ auVar140._20_4_;
                      auVar109._24_4_ = auVar85._8_4_ ^ auVar140._24_4_;
                      auVar109._28_4_ = auVar85._12_4_ ^ auVar140._28_4_;
                      auVar140 = auVar140 & ~auVar127;
                      if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar140 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar140 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar140 >> 0x7f,0) != '\0') ||
                            (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar140 >> 0xbf,0) != '\0') ||
                          (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar140[0x1f] < '\0') {
                        auVar140 = vmaskmovps_avx(auVar109,*(undefined1 (*) [32])local_2b00.hit);
                        *(undefined1 (*) [32])(local_2b00.ray + 0x180) = auVar140;
                        auVar140 = vmaskmovps_avx(auVar109,*(undefined1 (*) [32])
                                                            (local_2b00.hit + 0x20));
                        *(undefined1 (*) [32])(local_2b00.ray + 0x1a0) = auVar140;
                        auVar140 = vmaskmovps_avx(auVar109,*(undefined1 (*) [32])
                                                            (local_2b00.hit + 0x40));
                        *(undefined1 (*) [32])(local_2b00.ray + 0x1c0) = auVar140;
                        auVar140 = vmaskmovps_avx(auVar109,*(undefined1 (*) [32])
                                                            (local_2b00.hit + 0x60));
                        *(undefined1 (*) [32])(local_2b00.ray + 0x1e0) = auVar140;
                        auVar140 = vmaskmovps_avx(auVar109,*(undefined1 (*) [32])
                                                            (local_2b00.hit + 0x80));
                        *(undefined1 (*) [32])(local_2b00.ray + 0x200) = auVar140;
                        auVar140 = vmaskmovps_avx(auVar109,*(undefined1 (*) [32])
                                                            (local_2b00.hit + 0xa0));
                        *(undefined1 (*) [32])(local_2b00.ray + 0x220) = auVar140;
                        auVar140 = vmaskmovps_avx(auVar109,*(undefined1 (*) [32])
                                                            (local_2b00.hit + 0xc0));
                        *(undefined1 (*) [32])(local_2b00.ray + 0x240) = auVar140;
                        auVar140 = vmaskmovps_avx(auVar109,*(undefined1 (*) [32])
                                                            (local_2b00.hit + 0xe0));
                        *(undefined1 (*) [32])(local_2b00.ray + 0x260) = auVar140;
                        auVar140 = vmaskmovps_avx(auVar109,*(undefined1 (*) [32])
                                                            (local_2b00.hit + 0x100));
                        *(undefined1 (*) [32])(local_2b00.ray + 0x280) = auVar140;
                      }
                    }
                    auVar129 = ZEXT436(local_28e0._28_4_);
                    auVar140 = vblendvps_avx(local_28e0,*(undefined1 (*) [32])local_2940,auVar109);
                    *(undefined1 (*) [32])local_2940 = auVar140;
                    local_2760 = local_28e0;
                    uVar75 = local_2aa0._8_8_;
                  }
                }
              }
            }
          }
        }
      }
      local_2aa0._8_8_ = uVar75;
      local_28e0 = local_2760;
      auVar73._4_4_ = fStack_259c;
      auVar73._0_4_ = local_25a0;
      auVar73._8_4_ = fStack_2598;
      auVar73._12_4_ = fStack_2594;
      auVar73._16_4_ = fStack_2590;
      auVar73._20_4_ = fStack_258c;
      auVar73._24_4_ = fStack_2588;
      auVar73._28_4_ = fStack_2584;
      auVar9 = vsubps_avx(local_2a20,auVar73);
      auVar72._4_4_ = fStack_25bc;
      auVar72._0_4_ = local_25c0;
      auVar72._8_4_ = fStack_25b8;
      auVar72._12_4_ = fStack_25b4;
      auVar72._16_4_ = fStack_25b0;
      auVar72._20_4_ = fStack_25ac;
      auVar72._24_4_ = fStack_25a8;
      auVar72._28_4_ = fStack_25a4;
      auVar86 = vsubps_avx(_local_2a40,auVar72);
      auVar74._4_4_ = uStack_257c;
      auVar74._0_4_ = local_2580;
      auVar74._8_4_ = uStack_2578;
      auVar74._12_4_ = uStack_2574;
      auVar74._16_4_ = uStack_2570;
      auVar74._20_4_ = uStack_256c;
      auVar74._24_4_ = uStack_2568;
      auVar74._28_4_ = uStack_2564;
      auVar71._4_4_ = fStack_25dc;
      auVar71._0_4_ = local_25e0;
      auVar71._8_4_ = fStack_25d8;
      auVar71._12_4_ = fStack_25d4;
      auVar71._16_4_ = fStack_25d0;
      auVar71._20_4_ = fStack_25cc;
      auVar71._24_4_ = fStack_25c8;
      auVar71._28_4_ = fStack_25c4;
      auVar139 = vsubps_avx(auVar74,auVar71);
      auVar140 = vsubps_avx(_local_2880,local_2a20);
      auVar167 = vsubps_avx(_local_28a0,_local_2a40);
      auVar10 = vsubps_avx(_local_28c0,auVar74);
      fVar118 = auVar86._0_4_;
      fVar250 = auVar10._0_4_;
      fVar114 = auVar86._4_4_;
      fVar252 = auVar10._4_4_;
      auVar35._4_4_ = fVar252 * fVar114;
      auVar35._0_4_ = fVar250 * fVar118;
      fVar116 = auVar86._8_4_;
      fVar253 = auVar10._8_4_;
      auVar35._8_4_ = fVar253 * fVar116;
      fVar13 = auVar86._12_4_;
      fVar254 = auVar10._12_4_;
      auVar35._12_4_ = fVar254 * fVar13;
      fVar16 = auVar86._16_4_;
      fVar255 = auVar10._16_4_;
      auVar35._16_4_ = fVar255 * fVar16;
      fVar19 = auVar86._20_4_;
      fVar256 = auVar10._20_4_;
      auVar35._20_4_ = fVar256 * fVar19;
      fVar22 = auVar86._24_4_;
      fVar257 = auVar10._24_4_;
      auVar35._24_4_ = fVar257 * fVar22;
      auVar35._28_4_ = local_28c0._28_4_;
      fVar112 = auVar139._0_4_;
      fVar227 = auVar167._0_4_;
      auVar182._0_4_ = fVar227 * fVar112;
      fVar115 = auVar139._4_4_;
      fVar229 = auVar167._4_4_;
      auVar182._4_4_ = fVar229 * fVar115;
      fVar206 = auVar139._8_4_;
      fVar231 = auVar167._8_4_;
      auVar182._8_4_ = fVar231 * fVar206;
      fVar14 = auVar139._12_4_;
      fVar233 = auVar167._12_4_;
      auVar182._12_4_ = fVar233 * fVar14;
      fVar17 = auVar139._16_4_;
      fVar235 = auVar167._16_4_;
      auVar182._16_4_ = fVar235 * fVar17;
      fVar20 = auVar139._20_4_;
      fVar237 = auVar167._20_4_;
      auVar182._20_4_ = fVar237 * fVar20;
      fVar23 = auVar139._24_4_;
      fVar239 = auVar167._24_4_;
      auVar182._24_4_ = fVar239 * fVar23;
      auVar182._28_36_ = auVar129;
      auVar167 = vsubps_avx(auVar182._0_32_,auVar35);
      fVar137 = auVar140._0_4_;
      fVar146 = auVar140._4_4_;
      auVar36._4_4_ = fVar146 * fVar115;
      auVar36._0_4_ = fVar137 * fVar112;
      fVar147 = auVar140._8_4_;
      auVar36._8_4_ = fVar147 * fVar206;
      fVar148 = auVar140._12_4_;
      auVar36._12_4_ = fVar148 * fVar14;
      fVar149 = auVar140._16_4_;
      auVar36._16_4_ = fVar149 * fVar17;
      fVar150 = auVar140._20_4_;
      auVar36._20_4_ = fVar150 * fVar20;
      fVar151 = auVar140._24_4_;
      auVar36._24_4_ = fVar151 * fVar23;
      auVar36._28_4_ = auVar129._0_4_;
      fVar113 = auVar9._0_4_;
      fVar117 = auVar9._4_4_;
      auVar38._4_4_ = fVar252 * fVar117;
      auVar38._0_4_ = fVar250 * fVar113;
      fVar111 = auVar9._8_4_;
      auVar38._8_4_ = fVar253 * fVar111;
      fVar15 = auVar9._12_4_;
      auVar38._12_4_ = fVar254 * fVar15;
      fVar18 = auVar9._16_4_;
      auVar38._16_4_ = fVar255 * fVar18;
      fVar21 = auVar9._20_4_;
      auVar38._20_4_ = fVar256 * fVar21;
      fVar24 = auVar9._24_4_;
      fVar37 = auVar139._28_4_;
      auVar38._24_4_ = fVar257 * fVar24;
      auVar38._28_4_ = fVar37;
      local_2760 = vsubps_avx(auVar38,auVar36);
      auVar39._4_4_ = fVar229 * fVar117;
      auVar39._0_4_ = fVar227 * fVar113;
      auVar39._8_4_ = fVar231 * fVar111;
      auVar39._12_4_ = fVar233 * fVar15;
      auVar39._16_4_ = fVar235 * fVar18;
      auVar39._20_4_ = fVar237 * fVar21;
      auVar39._24_4_ = fVar239 * fVar24;
      auVar39._28_4_ = fVar37;
      auVar40._4_4_ = fVar114 * fVar146;
      auVar40._0_4_ = fVar118 * fVar137;
      auVar40._8_4_ = fVar116 * fVar147;
      auVar40._12_4_ = fVar13 * fVar148;
      auVar40._16_4_ = fVar16 * fVar149;
      auVar40._20_4_ = fVar19 * fVar150;
      auVar40._24_4_ = fVar22 * fVar151;
      auVar40._28_4_ = auVar9._28_4_;
      local_2740 = vsubps_avx(auVar40,auVar39);
      auVar140 = vsubps_avx(local_2a20,*(undefined1 (*) [32])ray);
      auVar182 = ZEXT3264(auVar140);
      auVar10 = vsubps_avx(_local_2a40,*(undefined1 (*) [32])(ray + 0x20));
      auVar25 = vsubps_avx(auVar74,*(undefined1 (*) [32])(ray + 0x40));
      fVar55 = *(float *)(ray + 0xa0);
      fVar56 = *(float *)(ray + 0xa4);
      fVar57 = *(float *)(ray + 0xa8);
      fVar58 = *(float *)(ray + 0xac);
      fVar59 = *(float *)(ray + 0xb0);
      fVar130 = *(float *)(ray + 0xb4);
      fVar135 = *(float *)(ray + 0xb8);
      fVar136 = *(float *)(ray + 0xc0);
      fVar152 = *(float *)(ray + 0xc4);
      fVar163 = *(float *)(ray + 200);
      fVar164 = *(float *)(ray + 0xcc);
      fVar176 = *(float *)(ray + 0xd0);
      fVar177 = *(float *)(ray + 0xd4);
      fVar185 = *(float *)(ray + 0xd8);
      fVar217 = auVar25._0_4_;
      auVar248._0_4_ = fVar217 * fVar55;
      fVar221 = auVar25._4_4_;
      auVar248._4_4_ = fVar221 * fVar56;
      fVar222 = auVar25._8_4_;
      auVar248._8_4_ = fVar222 * fVar57;
      fVar223 = auVar25._12_4_;
      auVar248._12_4_ = fVar223 * fVar58;
      fVar224 = auVar25._16_4_;
      auVar248._16_4_ = fVar224 * fVar59;
      fVar225 = auVar25._20_4_;
      auVar248._20_4_ = fVar225 * fVar130;
      fVar226 = auVar25._24_4_;
      auVar248._24_4_ = fVar226 * fVar135;
      auVar248._28_36_ = auVar244;
      fVar207 = auVar10._0_4_;
      auVar251._0_4_ = fVar207 * fVar136;
      fVar211 = auVar10._4_4_;
      auVar251._4_4_ = fVar211 * fVar152;
      fVar212 = auVar10._8_4_;
      auVar251._8_4_ = fVar212 * fVar163;
      fVar213 = auVar10._12_4_;
      auVar251._12_4_ = fVar213 * fVar164;
      fVar214 = auVar10._16_4_;
      auVar251._16_4_ = fVar214 * fVar176;
      fVar215 = auVar10._20_4_;
      auVar251._20_4_ = fVar215 * fVar177;
      fVar216 = auVar10._24_4_;
      auVar251._24_4_ = fVar216 * fVar185;
      auVar251._28_36_ = auVar245;
      auVar10 = vsubps_avx(auVar251._0_32_,auVar248._0_32_);
      fVar186 = *(float *)(ray + 0x80);
      fVar188 = *(float *)(ray + 0x84);
      fVar189 = *(float *)(ray + 0x88);
      fVar191 = *(float *)(ray + 0x8c);
      fVar192 = *(float *)(ray + 0x90);
      fVar194 = *(float *)(ray + 0x94);
      fVar196 = *(float *)(ray + 0x98);
      fVar178 = auVar140._0_4_;
      fVar187 = auVar140._4_4_;
      auVar41._4_4_ = fVar187 * fVar152;
      auVar41._0_4_ = fVar178 * fVar136;
      fVar190 = auVar140._8_4_;
      auVar41._8_4_ = fVar190 * fVar163;
      fVar193 = auVar140._12_4_;
      auVar41._12_4_ = fVar193 * fVar164;
      fVar195 = auVar140._16_4_;
      auVar41._16_4_ = fVar195 * fVar176;
      fVar197 = auVar140._20_4_;
      auVar41._20_4_ = fVar197 * fVar177;
      fVar198 = auVar140._24_4_;
      auVar41._24_4_ = fVar198 * fVar185;
      auVar41._28_4_ = auVar245._0_4_;
      auVar144._0_4_ = fVar217 * fVar186;
      auVar144._4_4_ = fVar221 * fVar188;
      auVar144._8_4_ = fVar222 * fVar189;
      auVar144._12_4_ = fVar223 * fVar191;
      auVar144._16_4_ = fVar224 * fVar192;
      auVar144._20_4_ = fVar225 * fVar194;
      auVar144._24_4_ = fVar226 * fVar196;
      auVar144._28_36_ = auVar249;
      auVar25 = vsubps_avx(auVar144._0_32_,auVar41);
      auVar42._4_4_ = fVar211 * fVar188;
      auVar42._0_4_ = fVar207 * fVar186;
      auVar42._8_4_ = fVar212 * fVar189;
      auVar42._12_4_ = fVar213 * fVar191;
      auVar42._16_4_ = fVar214 * fVar192;
      auVar42._20_4_ = fVar215 * fVar194;
      auVar42._24_4_ = fVar216 * fVar196;
      auVar42._28_4_ = auVar249._0_4_;
      auVar43._4_4_ = fVar187 * fVar56;
      auVar43._0_4_ = fVar178 * fVar55;
      auVar43._8_4_ = fVar190 * fVar57;
      auVar43._12_4_ = fVar193 * fVar58;
      auVar43._16_4_ = fVar195 * fVar59;
      auVar43._20_4_ = fVar197 * fVar130;
      auVar43._24_4_ = fVar198 * fVar135;
      auVar43._28_4_ = fVar37;
      auVar26 = vsubps_avx(auVar43,auVar42);
      auVar248 = ZEXT3264(auVar26);
      auVar170._0_4_ =
           auVar167._0_4_ * fVar186 + local_2760._0_4_ * fVar55 + local_2740._0_4_ * fVar136;
      auVar170._4_4_ =
           auVar167._4_4_ * fVar188 + local_2760._4_4_ * fVar56 + local_2740._4_4_ * fVar152;
      auVar170._8_4_ =
           auVar167._8_4_ * fVar189 + local_2760._8_4_ * fVar57 + local_2740._8_4_ * fVar163;
      auVar170._12_4_ =
           auVar167._12_4_ * fVar191 + local_2760._12_4_ * fVar58 + local_2740._12_4_ * fVar164;
      auVar170._16_4_ =
           auVar167._16_4_ * fVar192 + local_2760._16_4_ * fVar59 + local_2740._16_4_ * fVar176;
      auVar170._20_4_ =
           auVar167._20_4_ * fVar194 + local_2760._20_4_ * fVar130 + local_2740._20_4_ * fVar177;
      auVar170._24_4_ =
           auVar167._24_4_ * fVar196 + local_2760._24_4_ * fVar135 + local_2740._24_4_ * fVar185;
      auVar170._28_4_ = *(float *)(ray + 0x9c) + fVar37 + *(float *)(ray + 0xdc);
      auVar173 = ZEXT3264(auVar170);
      auVar122._8_4_ = 0x80000000;
      auVar122._0_8_ = 0x8000000080000000;
      auVar122._12_4_ = 0x80000000;
      auVar122._16_4_ = 0x80000000;
      auVar122._20_4_ = 0x80000000;
      auVar122._24_4_ = 0x80000000;
      auVar122._28_4_ = 0x80000000;
      auVar140 = vandps_avx(auVar170,auVar122);
      uVar76 = auVar140._0_4_;
      auVar143._0_4_ =
           (float)(uVar76 ^ (uint)(auVar10._0_4_ * fVar137 +
                                  fVar227 * auVar25._0_4_ + fVar250 * auVar26._0_4_));
      uVar230 = auVar140._4_4_;
      auVar143._4_4_ =
           (float)(uVar230 ^
                  (uint)(auVar10._4_4_ * fVar146 + fVar229 * auVar25._4_4_ + fVar252 * auVar26._4_4_
                        ));
      uVar232 = auVar140._8_4_;
      auVar143._8_4_ =
           (float)(uVar232 ^
                  (uint)(auVar10._8_4_ * fVar147 + fVar231 * auVar25._8_4_ + fVar253 * auVar26._8_4_
                        ));
      uVar234 = auVar140._12_4_;
      auVar143._12_4_ =
           (float)(uVar234 ^
                  (uint)(auVar10._12_4_ * fVar148 +
                        fVar233 * auVar25._12_4_ + fVar254 * auVar26._12_4_));
      uVar236 = auVar140._16_4_;
      auVar143._16_4_ =
           (float)(uVar236 ^
                  (uint)(auVar10._16_4_ * fVar149 +
                        fVar235 * auVar25._16_4_ + fVar255 * auVar26._16_4_));
      uVar238 = auVar140._20_4_;
      auVar143._20_4_ =
           (float)(uVar238 ^
                  (uint)(auVar10._20_4_ * fVar150 +
                        fVar237 * auVar25._20_4_ + fVar256 * auVar26._20_4_));
      uVar240 = auVar140._24_4_;
      auVar143._24_4_ =
           (float)(uVar240 ^
                  (uint)(auVar10._24_4_ * fVar151 +
                        fVar239 * auVar25._24_4_ + fVar257 * auVar26._24_4_));
      uVar241 = auVar140._28_4_;
      auVar143._28_4_ =
           uVar241 ^ (uint)(*(float *)(ray + 0x9c) + fVar37 + *(float *)(ray + 0xdc) + -0.0);
      auVar140 = vcmpps_avx(auVar143,_DAT_01faff00,5);
      auVar155 = local_29e0 & auVar140;
      _local_2a40 = local_2740;
      if ((((((((auVar155 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar155 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar155 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar155 >> 0x7f,0) != '\0') ||
            (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar155 >> 0xbf,0) != '\0') ||
          (auVar155 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar155[0x1f] < '\0') {
        auVar140 = vandps_avx(auVar140,local_29e0);
        auVar166 = vpackssdw_avx(auVar140._0_16_,auVar140._16_16_);
        auVar248 = ZEXT3264(auVar167);
        auVar161._0_4_ =
             (float)(uVar76 ^ (uint)(auVar10._0_4_ * fVar113 +
                                    auVar25._0_4_ * fVar118 + auVar26._0_4_ * fVar112));
        auVar161._4_4_ =
             (float)(uVar230 ^
                    (uint)(auVar10._4_4_ * fVar117 +
                          auVar25._4_4_ * fVar114 + auVar26._4_4_ * fVar115));
        auVar161._8_4_ =
             (float)(uVar232 ^
                    (uint)(auVar10._8_4_ * fVar111 +
                          auVar25._8_4_ * fVar116 + auVar26._8_4_ * fVar206));
        auVar161._12_4_ =
             (float)(uVar234 ^
                    (uint)(auVar10._12_4_ * fVar15 +
                          auVar25._12_4_ * fVar13 + auVar26._12_4_ * fVar14));
        auVar161._16_4_ =
             (float)(uVar236 ^
                    (uint)(auVar10._16_4_ * fVar18 +
                          auVar25._16_4_ * fVar16 + auVar26._16_4_ * fVar17));
        auVar161._20_4_ =
             (float)(uVar238 ^
                    (uint)(auVar10._20_4_ * fVar21 +
                          auVar25._20_4_ * fVar19 + auVar26._20_4_ * fVar20));
        auVar161._24_4_ =
             (float)(uVar240 ^
                    (uint)(auVar10._24_4_ * fVar24 +
                          auVar25._24_4_ * fVar22 + auVar26._24_4_ * fVar23));
        auVar161._28_4_ = uVar241 ^ (uint)(fVar37 + fVar37 + 0.0);
        auVar140 = vcmpps_avx(auVar161,_DAT_01faff00,5);
        auVar85 = vpackssdw_avx(auVar140._0_16_,auVar140._16_16_);
        auVar166 = vpand_avx(auVar166,auVar85);
        auVar85 = vpmovsxwd_avx(auVar166);
        auVar138 = vpunpckhwd_avx(auVar166,auVar166);
        auVar99._16_16_ = auVar138;
        auVar99._0_16_ = auVar85;
        if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar99 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar99 >> 0x7f,0) != '\0') ||
              (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar138 >> 0x3f,0) != '\0') ||
            (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar138[0xf] < '\0') {
          auVar100._8_4_ = 0x7fffffff;
          auVar100._0_8_ = 0x7fffffff7fffffff;
          auVar100._12_4_ = 0x7fffffff;
          auVar100._16_4_ = 0x7fffffff;
          auVar100._20_4_ = 0x7fffffff;
          auVar100._24_4_ = 0x7fffffff;
          auVar100._28_4_ = 0x7fffffff;
          auVar140 = vandps_avx(auVar170,auVar100);
          auVar10 = vsubps_avx(auVar140,auVar143);
          auVar10 = vcmpps_avx(auVar10,auVar161,5);
          auVar85 = vpackssdw_avx(auVar10._0_16_,auVar10._16_16_);
          auVar166 = vpand_avx(auVar166,auVar85);
          auVar85 = vpmovsxwd_avx(auVar166);
          auVar138 = vpunpckhwd_avx(auVar166,auVar166);
          auVar101._16_16_ = auVar138;
          auVar101._0_16_ = auVar85;
          if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar101 >> 0x7f,0) != '\0') ||
                (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar138 >> 0x3f,0) != '\0') ||
              (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar138[0xf] < '\0') {
            fVar118 = auVar138._12_4_ + 0.0 + 0.0;
            auVar181._0_4_ =
                 (float)(uVar76 ^ (uint)(auVar167._0_4_ * fVar178 +
                                        fVar207 * local_2760._0_4_ + fVar217 * local_2740._0_4_));
            auVar181._4_4_ =
                 (float)(uVar230 ^
                        (uint)(auVar167._4_4_ * fVar187 +
                              fVar211 * local_2760._4_4_ + fVar221 * local_2740._4_4_));
            auVar181._8_4_ =
                 (float)(uVar232 ^
                        (uint)(auVar167._8_4_ * fVar190 +
                              fVar212 * local_2760._8_4_ + fVar222 * local_2740._8_4_));
            auVar181._12_4_ =
                 (float)(uVar234 ^
                        (uint)(auVar167._12_4_ * fVar193 +
                              fVar213 * local_2760._12_4_ + fVar223 * local_2740._12_4_));
            auVar181._16_4_ =
                 (float)(uVar236 ^
                        (uint)(auVar167._16_4_ * fVar195 +
                              fVar214 * local_2760._16_4_ + fVar224 * local_2740._16_4_));
            auVar181._20_4_ =
                 (float)(uVar238 ^
                        (uint)(auVar167._20_4_ * fVar197 +
                              fVar215 * local_2760._20_4_ + fVar225 * local_2740._20_4_));
            auVar181._24_4_ =
                 (float)(uVar240 ^
                        (uint)(auVar167._24_4_ * fVar198 +
                              fVar216 * local_2760._24_4_ + fVar226 * local_2740._24_4_));
            auVar181._28_4_ = uVar241 ^ (uint)fVar118;
            auVar182 = ZEXT3264(auVar181);
            fVar112 = auVar140._0_4_;
            fVar113 = auVar140._4_4_;
            auVar50._4_4_ = fVar113 * *(float *)(ray + 100);
            auVar50._0_4_ = fVar112 * *(float *)(ray + 0x60);
            fVar114 = auVar140._8_4_;
            auVar50._8_4_ = fVar114 * *(float *)(ray + 0x68);
            fVar115 = auVar140._12_4_;
            auVar50._12_4_ = fVar115 * *(float *)(ray + 0x6c);
            fVar117 = auVar140._16_4_;
            auVar50._16_4_ = fVar117 * *(float *)(ray + 0x70);
            fVar116 = auVar140._20_4_;
            auVar50._20_4_ = fVar116 * *(float *)(ray + 0x74);
            fVar206 = auVar140._24_4_;
            auVar50._24_4_ = fVar206 * *(float *)(ray + 0x78);
            auVar50._28_4_ = fVar118;
            auVar10 = vcmpps_avx(auVar50,auVar181,1);
            local_2a20 = *(undefined1 (*) [32])(ray + 0x100);
            auVar51._4_4_ = local_2a20._4_4_ * fVar113;
            auVar51._0_4_ = local_2a20._0_4_ * fVar112;
            auVar51._8_4_ = local_2a20._8_4_ * fVar114;
            auVar51._12_4_ = local_2a20._12_4_ * fVar115;
            auVar51._16_4_ = local_2a20._16_4_ * fVar117;
            auVar51._20_4_ = local_2a20._20_4_ * fVar116;
            auVar51._24_4_ = local_2a20._24_4_ * fVar206;
            auVar51._28_4_ = 0;
            auVar25 = vcmpps_avx(auVar181,auVar51,2);
            auVar10 = vandps_avx(auVar10,auVar25);
            auVar85 = vpackssdw_avx(auVar10._0_16_,auVar10._16_16_);
            auVar166 = vpand_avx(auVar166,auVar85);
            auVar85 = vpmovsxwd_avx(auVar166);
            auVar138 = vpshufd_avx(auVar166,0xee);
            auVar138 = vpmovsxwd_avx(auVar138);
            auVar102._16_16_ = auVar138;
            auVar102._0_16_ = auVar85;
            if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar102 >> 0x7f,0) != '\0') ||
                  (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar138 >> 0x3f,0) != '\0') ||
                (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar138[0xf] < '\0') {
              auVar10 = vcmpps_avx(auVar170,_DAT_01faff00,4);
              auVar85 = vpackssdw_avx(auVar10._0_16_,auVar10._16_16_);
              auVar166 = vpand_avx(auVar166,auVar85);
              auVar85 = vpmovsxwd_avx(auVar166);
              auVar173 = ZEXT1664(auVar85);
              auVar166 = vpunpckhwd_avx(auVar166,auVar166);
              auVar103._16_16_ = auVar166;
              auVar103._0_16_ = auVar85;
              if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar103 >> 0x7f,0) != '\0') ||
                    (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB161(auVar166 >> 0x3f,0) != '\0') ||
                  (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar166[0xf] < '\0') {
                uVar230 = *(uint *)(lVar84 + lVar83 * 4);
                pGVar6 = (context->scene->geometries).items[uVar230].ptr;
                uVar76 = pGVar6->mask;
                auVar104._4_4_ = uVar76;
                auVar104._0_4_ = uVar76;
                auVar104._8_4_ = uVar76;
                auVar104._12_4_ = uVar76;
                auVar104._16_4_ = uVar76;
                auVar104._20_4_ = uVar76;
                auVar104._24_4_ = uVar76;
                auVar104._28_4_ = uVar76;
                auVar10 = vandps_avx(auVar104,*(undefined1 (*) [32])(ray + 0x120));
                auVar138 = vpcmpeqd_avx(auVar10._16_16_,(undefined1  [16])0x0);
                auVar11 = vpcmpeqd_avx(auVar10._0_16_,(undefined1  [16])0x0);
                auVar124._16_16_ = auVar138;
                auVar124._0_16_ = auVar11;
                auVar10 = vblendps_avx(ZEXT1632(auVar11),auVar124,0xf0);
                auVar220._16_16_ = auVar166;
                auVar220._0_16_ = auVar85;
                auVar25 = auVar220 & ~auVar10;
                if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar25 >> 0x7f,0) != '\0') ||
                      (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar25 >> 0xbf,0) != '\0') ||
                    (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar25[0x1f] < '\0') {
                  auVar25 = vrcpps_avx(auVar140);
                  fVar118 = auVar25._0_4_;
                  fVar111 = auVar25._4_4_;
                  auVar52._4_4_ = fVar113 * fVar111;
                  auVar52._0_4_ = fVar112 * fVar118;
                  fVar112 = auVar25._8_4_;
                  auVar52._8_4_ = fVar114 * fVar112;
                  fVar113 = auVar25._12_4_;
                  auVar52._12_4_ = fVar115 * fVar113;
                  fVar114 = auVar25._16_4_;
                  auVar52._16_4_ = fVar117 * fVar114;
                  fVar115 = auVar25._20_4_;
                  auVar52._20_4_ = fVar116 * fVar115;
                  fVar117 = auVar25._24_4_;
                  auVar52._24_4_ = fVar206 * fVar117;
                  auVar52._28_4_ = auVar138._12_4_;
                  auVar205._8_4_ = 0x3f800000;
                  auVar205._0_8_ = 0x3f8000003f800000;
                  auVar205._12_4_ = 0x3f800000;
                  auVar205._16_4_ = 0x3f800000;
                  auVar205._20_4_ = 0x3f800000;
                  auVar205._24_4_ = 0x3f800000;
                  auVar205._28_4_ = 0x3f800000;
                  auVar26 = vsubps_avx(auVar205,auVar52);
                  fVar118 = fVar118 + fVar118 * auVar26._0_4_;
                  fVar111 = fVar111 + fVar111 * auVar26._4_4_;
                  fVar112 = fVar112 + fVar112 * auVar26._8_4_;
                  fVar113 = fVar113 + fVar113 * auVar26._12_4_;
                  fVar114 = fVar114 + fVar114 * auVar26._16_4_;
                  fVar115 = fVar115 + fVar115 * auVar26._20_4_;
                  fVar117 = fVar117 + fVar117 * auVar26._24_4_;
                  auVar166._0_4_ = fVar118 * auVar181._0_4_;
                  auVar166._4_4_ = fVar111 * auVar181._4_4_;
                  auVar166._8_4_ = fVar112 * auVar181._8_4_;
                  auVar166._12_4_ = fVar113 * auVar181._12_4_;
                  auVar172._16_4_ = fVar114 * auVar181._16_4_;
                  auVar172._0_16_ = auVar166;
                  auVar172._20_4_ = fVar115 * auVar181._20_4_;
                  auVar172._24_4_ = fVar117 * auVar181._24_4_;
                  auVar172._28_4_ = 0;
                  auVar173 = ZEXT3264(auVar172);
                  auVar53._4_4_ = fVar111 * auVar143._4_4_;
                  auVar53._0_4_ = fVar118 * auVar143._0_4_;
                  auVar53._8_4_ = fVar112 * auVar143._8_4_;
                  auVar53._12_4_ = fVar113 * auVar143._12_4_;
                  auVar53._16_4_ = fVar114 * auVar143._16_4_;
                  auVar53._20_4_ = fVar115 * auVar143._20_4_;
                  auVar53._24_4_ = fVar117 * auVar143._24_4_;
                  auVar53._28_4_ = auVar26._28_4_;
                  auVar140 = vminps_avx(auVar53,auVar205);
                  auVar54._4_4_ = fVar111 * auVar161._4_4_;
                  auVar54._0_4_ = fVar118 * auVar161._0_4_;
                  auVar54._8_4_ = fVar112 * auVar161._8_4_;
                  auVar54._12_4_ = fVar113 * auVar161._12_4_;
                  auVar54._16_4_ = fVar114 * auVar161._16_4_;
                  auVar54._20_4_ = fVar115 * auVar161._20_4_;
                  auVar54._24_4_ = fVar117 * auVar161._24_4_;
                  auVar54._28_4_ = auVar25._28_4_ + auVar26._28_4_;
                  auVar25 = vminps_avx(auVar54,auVar205);
                  auVar26 = vsubps_avx(auVar205,auVar140);
                  auVar155 = vsubps_avx(auVar205,auVar25);
                  auVar69._8_8_ = uStack_2658;
                  auVar69._0_8_ = local_2660;
                  auVar69._16_8_ = uStack_2650;
                  auVar69._24_8_ = uStack_2648;
                  local_2720 = vblendvps_avx(auVar140,auVar26,auVar69);
                  auVar182 = ZEXT3264(local_2720);
                  local_2700 = vblendvps_avx(auVar25,auVar155,auVar69);
                  local_2ac0 = vandnps_avx(auVar10,auVar220);
                  uVar76 = *(uint *)((long)&local_28f0 + lVar83 * 4);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    auVar140 = vmaskmovps_avx(local_2ac0,auVar172);
                    *(undefined1 (*) [32])local_2940 = auVar140;
                    auVar140 = vmaskmovps_avx(local_2ac0,auVar167);
                    *(undefined1 (*) [32])local_2a48 = auVar140;
                    auVar140 = vmaskmovps_avx(local_2ac0,local_2760);
                    *(undefined1 (*) [32])local_2a50 = auVar140;
                    auVar140 = vmaskmovps_avx(local_2ac0,local_2740);
                    *(undefined1 (*) [32])local_2a58 = auVar140;
                    auVar140 = vmaskmovps_avx(local_2ac0,local_2720);
                    *(undefined1 (*) [32])local_2a60 = auVar140;
                    auVar140 = vmaskmovps_avx(local_2ac0,local_2700);
                    *(undefined1 (*) [32])local_2a68 = auVar140;
                    auVar166 = vshufps_avx(ZEXT416(uVar76),ZEXT416(uVar76),0);
                    auVar105._16_16_ = auVar166;
                    auVar105._0_16_ = auVar166;
                    auVar140 = vmaskmovps_avx(local_2ac0,auVar105);
                    *(undefined1 (*) [32])local_2a70 = auVar140;
                    auVar166 = vpshufd_avx(ZEXT416(uVar230),0);
                    auVar106._16_16_ = auVar166;
                    auVar106._0_16_ = auVar166;
                    auVar140 = vmaskmovps_avx(local_2ac0,auVar106);
                    *(undefined1 (*) [32])local_2a78 = auVar140;
                    uVar76 = context->user->instID[0];
                    auVar107._4_4_ = uVar76;
                    auVar107._0_4_ = uVar76;
                    auVar107._8_4_ = uVar76;
                    auVar107._12_4_ = uVar76;
                    auVar107._16_4_ = uVar76;
                    auVar107._20_4_ = uVar76;
                    auVar107._24_4_ = uVar76;
                    auVar107._28_4_ = uVar76;
                    auVar140 = vmaskmovps_avx(local_2ac0,auVar107);
                    *(undefined1 (*) [32])local_2a80 = auVar140;
                    uVar76 = context->user->instPrimID[0];
                    auVar108._4_4_ = uVar76;
                    auVar108._0_4_ = uVar76;
                    auVar108._8_4_ = uVar76;
                    auVar108._12_4_ = uVar76;
                    auVar108._16_4_ = uVar76;
                    auVar108._20_4_ = uVar76;
                    auVar108._24_4_ = uVar76;
                    auVar108._28_4_ = uVar76;
                    auVar140 = vmaskmovps_avx(local_2ac0,auVar108);
                    *(undefined1 (*) [32])local_2a88 = auVar140;
                  }
                  else {
                    pRVar7 = context->user;
                    auStack_26b0 = vpshufd_avx(ZEXT416(uVar230),0);
                    auStack_26d0 = vshufps_avx(ZEXT416(uVar76),ZEXT416(uVar76),0);
                    local_2780[0] = (RTCHitN)auVar167[0];
                    local_2780[1] = (RTCHitN)auVar167[1];
                    local_2780[2] = (RTCHitN)auVar167[2];
                    local_2780[3] = (RTCHitN)auVar167[3];
                    local_2780[4] = (RTCHitN)auVar167[4];
                    local_2780[5] = (RTCHitN)auVar167[5];
                    local_2780[6] = (RTCHitN)auVar167[6];
                    local_2780[7] = (RTCHitN)auVar167[7];
                    local_2780[8] = (RTCHitN)auVar167[8];
                    local_2780[9] = (RTCHitN)auVar167[9];
                    local_2780[10] = (RTCHitN)auVar167[10];
                    local_2780[0xb] = (RTCHitN)auVar167[0xb];
                    local_2780[0xc] = (RTCHitN)auVar167[0xc];
                    local_2780[0xd] = (RTCHitN)auVar167[0xd];
                    local_2780[0xe] = (RTCHitN)auVar167[0xe];
                    local_2780[0xf] = (RTCHitN)auVar167[0xf];
                    local_2780[0x10] = (RTCHitN)auVar167[0x10];
                    local_2780[0x11] = (RTCHitN)auVar167[0x11];
                    local_2780[0x12] = (RTCHitN)auVar167[0x12];
                    local_2780[0x13] = (RTCHitN)auVar167[0x13];
                    local_2780[0x14] = (RTCHitN)auVar167[0x14];
                    local_2780[0x15] = (RTCHitN)auVar167[0x15];
                    local_2780[0x16] = (RTCHitN)auVar167[0x16];
                    local_2780[0x17] = (RTCHitN)auVar167[0x17];
                    local_2780[0x18] = (RTCHitN)auVar167[0x18];
                    local_2780[0x19] = (RTCHitN)auVar167[0x19];
                    local_2780[0x1a] = (RTCHitN)auVar167[0x1a];
                    local_2780[0x1b] = (RTCHitN)auVar167[0x1b];
                    local_2780[0x1c] = (RTCHitN)auVar167[0x1c];
                    local_2780[0x1d] = (RTCHitN)auVar167[0x1d];
                    local_2780[0x1e] = (RTCHitN)auVar167[0x1e];
                    local_2780[0x1f] = (RTCHitN)auVar167[0x1f];
                    local_26e0 = auStack_26d0;
                    local_26c0 = auStack_26b0;
                    auVar140 = vcmpps_avx(ZEXT1632(auStack_26b0),ZEXT1632(auStack_26b0),0xf);
                    local_2a90[1] = auVar140;
                    *local_2a90 = auVar140;
                    local_26a0 = pRVar7->instID[0];
                    uStack_269c = local_26a0;
                    uStack_2698 = local_26a0;
                    uStack_2694 = local_26a0;
                    uStack_2690 = local_26a0;
                    uStack_268c = local_26a0;
                    uStack_2688 = local_26a0;
                    uStack_2684 = local_26a0;
                    local_2680 = pRVar7->instPrimID[0];
                    uStack_267c = local_2680;
                    uStack_2678 = local_2680;
                    uStack_2674 = local_2680;
                    uStack_2670 = local_2680;
                    uStack_266c = local_2680;
                    uStack_2668 = local_2680;
                    uStack_2664 = local_2680;
                    auVar140 = vblendvps_avx(local_2a20,auVar172,local_2ac0);
                    *(undefined1 (*) [32])(ray + 0x100) = auVar140;
                    local_2b00.valid = (int *)local_2ac0;
                    local_2b00.geometryUserPtr = pGVar6->userPtr;
                    local_2b00.context = context->user;
                    local_2b00.hit = local_2780;
                    local_2b00.N = 8;
                    stack0xffffffffffffd5c8 = local_2740._8_24_;
                    local_2a40._0_8_ = pGVar6;
                    _local_28c0 = auVar139;
                    _local_28a0 = auVar86;
                    _local_2880 = auVar9;
                    if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                      local_2b00.ray = (RTCRayN *)ray;
                    }
                    else {
                      auVar173 = ZEXT1664(auVar166);
                      auVar182 = ZEXT1664(local_2720._0_16_);
                      auVar248 = ZEXT1664(auVar167._0_16_);
                      local_2b00.ray = (RTCRayN *)ray;
                      (*pGVar6->intersectionFilterN)(&local_2b00);
                    }
                    auVar166 = vpcmpeqd_avx(local_2ac0._0_16_,ZEXT816(0) << 0x40);
                    auVar85 = vpcmpeqd_avx(local_2ac0._16_16_,ZEXT816(0) << 0x40);
                    auVar126._16_16_ = auVar85;
                    auVar126._0_16_ = auVar166;
                    auVar140 = _DAT_01fe9960 & ~auVar126;
                    if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar140 >> 0x7f,0) == '\0') &&
                          (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar140 >> 0xbf,0) == '\0') &&
                        (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar140[0x1f]) {
                      auVar110._0_8_ = auVar166._0_8_ ^ 0xffffffffffffffff;
                      auVar110._8_4_ = auVar166._8_4_ ^ 0xffffffff;
                      auVar110._12_4_ = auVar166._12_4_ ^ 0xffffffff;
                      auVar110._16_4_ = auVar85._0_4_ ^ 0xffffffff;
                      auVar110._20_4_ = auVar85._4_4_ ^ 0xffffffff;
                      auVar110._24_4_ = auVar85._8_4_ ^ 0xffffffff;
                      auVar110._28_4_ = auVar85._12_4_ ^ 0xffffffff;
                    }
                    else {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_2a40._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar173 = ZEXT1664(auVar173._0_16_);
                        auVar182 = ZEXT1664(auVar182._0_16_);
                        auVar248 = ZEXT1664(auVar248._0_16_);
                        (*p_Var8)(&local_2b00);
                      }
                      auVar166 = vpcmpeqd_avx(local_2ac0._0_16_,(undefined1  [16])0x0);
                      auVar85 = vpcmpeqd_avx(local_2ac0._16_16_,(undefined1  [16])0x0);
                      auVar128._16_16_ = auVar85;
                      auVar128._0_16_ = auVar166;
                      auVar140 = vcmpps_avx(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                            SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xf);
                      auVar110._0_4_ = auVar166._0_4_ ^ auVar140._0_4_;
                      auVar110._4_4_ = auVar166._4_4_ ^ auVar140._4_4_;
                      auVar110._8_4_ = auVar166._8_4_ ^ auVar140._8_4_;
                      auVar110._12_4_ = auVar166._12_4_ ^ auVar140._12_4_;
                      auVar110._16_4_ = auVar85._0_4_ ^ auVar140._16_4_;
                      auVar110._20_4_ = auVar85._4_4_ ^ auVar140._20_4_;
                      auVar110._24_4_ = auVar85._8_4_ ^ auVar140._24_4_;
                      auVar110._28_4_ = auVar85._12_4_ ^ auVar140._28_4_;
                      auVar140 = auVar140 & ~auVar128;
                      if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar140 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar140 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar140 >> 0x7f,0) != '\0') ||
                            (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar140 >> 0xbf,0) != '\0') ||
                          (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar140[0x1f] < '\0') {
                        auVar140 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])local_2b00.hit);
                        *(undefined1 (*) [32])(local_2b00.ray + 0x180) = auVar140;
                        auVar140 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])
                                                            (local_2b00.hit + 0x20));
                        *(undefined1 (*) [32])(local_2b00.ray + 0x1a0) = auVar140;
                        auVar140 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])
                                                            (local_2b00.hit + 0x40));
                        *(undefined1 (*) [32])(local_2b00.ray + 0x1c0) = auVar140;
                        auVar140 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])
                                                            (local_2b00.hit + 0x60));
                        *(undefined1 (*) [32])(local_2b00.ray + 0x1e0) = auVar140;
                        auVar140 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])
                                                            (local_2b00.hit + 0x80));
                        *(undefined1 (*) [32])(local_2b00.ray + 0x200) = auVar140;
                        auVar140 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])
                                                            (local_2b00.hit + 0xa0));
                        *(undefined1 (*) [32])(local_2b00.ray + 0x220) = auVar140;
                        auVar140 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])
                                                            (local_2b00.hit + 0xc0));
                        *(undefined1 (*) [32])(local_2b00.ray + 0x240) = auVar140;
                        auVar140 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])
                                                            (local_2b00.hit + 0xe0));
                        *(undefined1 (*) [32])(local_2b00.ray + 0x260) = auVar140;
                        auVar140 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])
                                                            (local_2b00.hit + 0x100));
                        *(undefined1 (*) [32])(local_2b00.ray + 0x280) = auVar140;
                      }
                    }
                    auVar140 = vblendvps_avx(local_2a20,*(undefined1 (*) [32])local_2940,auVar110);
                    *(undefined1 (*) [32])local_2940 = auVar140;
                    local_2760 = local_2a20;
                  }
                }
              }
            }
          }
        }
      }
      local_2a20 = local_2760;
      lVar83 = lVar83 + 1;
    } while (lVar83 != 4);
    local_2ad0 = local_2ad0 + 1;
    lVar84 = lVar84 + 0xe0;
  } while (local_2ad0 != local_2ac8);
LAB_00462479:
  auVar251 = ZEXT3264(local_2960);
  auVar140 = vcmpps_avx(*(undefined1 (*) [32])local_2940,local_2960,1);
  auVar140 = local_29e0 & auVar140;
  if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar140 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar140 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar140 >> 0x7f,0) != '\0') ||
        (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar140 >> 0xbf,0) != '\0') ||
      (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar140[0x1f] < '\0')
  {
    auVar140 = vblendvps_avx(local_2960,*(undefined1 (*) [32])local_2940,local_29e0);
    auVar251 = ZEXT3264(auVar140);
    auVar9 = vshufps_avx(auVar140,auVar140,0xb1);
    auVar140 = vmaxps_avx(auVar140,auVar9);
    auVar9 = vshufpd_avx(auVar140,auVar140,5);
    auVar140 = vmaxps_avx(auVar140,auVar9);
    local_29f0 = vmaxss_avx(auVar140._0_16_,auVar140._16_16_);
  }
LAB_004624cc:
  _local_2a40 = vshufps_avx(local_29f0,local_29f0,0);
  local_29e0._0_16_ = auVar251._16_16_;
  local_2a20._0_16_ = auVar251._0_16_;
  if (puVar82 == &local_23a0) goto LAB_00462524;
  goto LAB_004610c0;
LAB_00462524:
  local_2920 = local_2920 & local_29a0;
  if (local_2920 == 0) {
    return;
  }
  goto LAB_00460c10;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersectCoherent(vint<K>* __restrict__ valid_i,
                                                                                                       Accel::Intersectors* __restrict__ This,
                                                                                                       RayHitK<K>& __restrict__ ray,
                                                                                                       RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *(float*)&stackPtr->dist;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active))) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            curDist = pos_inf;
            
#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const vfloat<K> childDist = fmin[i];
                const NodeRef child = node->child(i);
                BVHN<N>::prefetch(child);
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    stackPtr->ptr = cur;
                    *(float*)&stackPtr->dist = toScalar(curDist);
                    stackPtr++;
                  }
                  curDist = childDist;
                  cur = child;
                }
                /* push hit child onto stack */
                else {
                  num_child_hits++;
                  stackPtr->ptr = child;
                  *(float*)&stackPtr->dist = toScalar(childDist);
                  stackPtr++;
                }                
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;

            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (stackPtr[-2].dist < stackPtr[-1].dist)
                std::swap(stackPtr[-2],stackPtr[-1]);
              if (unlikely(num_child_hits >= 3))
              {
                if (stackPtr[-3].dist < stackPtr[-1].dist)
                  std::swap(stackPtr[-3],stackPtr[-1]);
                if (stackPtr[-3].dist < stackPtr[-2].dist)
                  std::swap(stackPtr[-3],stackPtr[-2]);
              }
            }
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);

          /* reduce max distance interval on successful intersection */
          if (likely(any((ray.tfar < tray.tfar) & valid_leaf)))
          {
            tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);
            frustum.template updateMaxDist<K>(tray.tfar);
          }

          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        
      } while(valid_bits);
    }